

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [12];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  byte bVar55;
  ulong uVar56;
  byte bVar57;
  byte bVar58;
  byte bVar59;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  ulong uVar60;
  byte bVar61;
  ulong unaff_R13;
  long lVar62;
  undefined1 uVar63;
  bool bVar64;
  undefined1 uVar65;
  bool bVar66;
  ulong uVar67;
  uint uVar68;
  uint uVar120;
  uint uVar121;
  uint uVar123;
  uint uVar124;
  uint uVar125;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  uint uVar122;
  uint uVar126;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float pp;
  undefined1 auVar128 [16];
  float fVar127;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar162;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar186;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined4 uVar201;
  float fVar202;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  undefined1 auVar206 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  float fVar226;
  undefined1 auVar219 [28];
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar220 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  undefined4 uVar231;
  undefined4 uVar232;
  undefined1 auVar230 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_8b4;
  ulong local_8b0;
  ulong local_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 auStack_850 [16];
  undefined1 local_830 [16];
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  ulong local_7f8;
  uint local_7ec;
  uint local_7e8;
  undefined4 local_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [16];
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined8 local_610;
  undefined4 local_608;
  float local_604;
  undefined4 local_600;
  undefined4 local_5fc;
  undefined4 local_5f8;
  uint local_5f4;
  uint local_5f0;
  Primitive *local_5d8;
  ulong local_5d0;
  ulong local_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 auStack_590 [16];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined4 local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar110 [32];
  
  PVar3 = prim[1];
  uVar60 = (ulong)(byte)PVar3;
  fVar202 = *(float *)(prim + uVar60 * 0x19 + 0x12);
  auVar13 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar60 * 0x19 + 6));
  fVar162 = fVar202 * (ray->dir).field_0.m128[0];
  fVar186 = fVar202 * auVar13._0_4_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar60 * 4 + 6);
  auVar84 = vpmovsxbd_avx2(auVar71);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar60 * 5 + 6);
  auVar85 = vpmovsxbd_avx2(auVar72);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar60 * 6 + 6);
  auVar86 = vpmovsxbd_avx2(auVar73);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar60 * 0xb + 6);
  auVar87 = vpmovsxbd_avx2(auVar74);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6);
  auVar88 = vpmovsxbd_avx2(auVar69);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + (uint)(byte)PVar3 * 0xc + uVar60 + 6);
  auVar89 = vpmovsxbd_avx2(auVar75);
  auVar89 = vcvtdq2ps_avx(auVar89);
  uVar67 = (ulong)(uint)((int)(uVar60 * 9) * 2);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar67 + 6);
  auVar90 = vpmovsxbd_avx2(auVar70);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar67 + uVar60 + 6);
  auVar82 = vpmovsxbd_avx2(auVar76);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar91 = vcvtdq2ps_avx(auVar82);
  uVar56 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar56 + 6);
  auVar92 = vpmovsxbd_avx2(auVar77);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar98._4_4_ = fVar162;
  auVar98._0_4_ = fVar162;
  auVar98._8_4_ = fVar162;
  auVar98._12_4_ = fVar162;
  auVar98._16_4_ = fVar162;
  auVar98._20_4_ = fVar162;
  auVar98._24_4_ = fVar162;
  auVar98._28_4_ = fVar162;
  auVar78 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar83 = ZEXT1632(CONCAT412(fVar202 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar202 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar202 * (ray->dir).field_0.m128[1],fVar162))));
  auVar79 = vpermps_avx512vl(auVar78,auVar83);
  auVar80 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar81 = vpermps_avx512vl(auVar80,auVar83);
  fVar162 = auVar81._0_4_;
  auVar243._0_4_ = fVar162 * auVar86._0_4_;
  fVar207 = auVar81._4_4_;
  auVar243._4_4_ = fVar207 * auVar86._4_4_;
  fVar208 = auVar81._8_4_;
  auVar243._8_4_ = fVar208 * auVar86._8_4_;
  fVar127 = auVar81._12_4_;
  auVar243._12_4_ = fVar127 * auVar86._12_4_;
  fVar209 = auVar81._16_4_;
  auVar243._16_4_ = fVar209 * auVar86._16_4_;
  fVar210 = auVar81._20_4_;
  auVar243._20_4_ = fVar210 * auVar86._20_4_;
  fVar211 = auVar81._24_4_;
  auVar243._28_36_ = in_ZMM4._28_36_;
  auVar243._24_4_ = fVar211 * auVar86._24_4_;
  auVar83._4_4_ = auVar89._4_4_ * fVar207;
  auVar83._0_4_ = auVar89._0_4_ * fVar162;
  auVar83._8_4_ = auVar89._8_4_ * fVar208;
  auVar83._12_4_ = auVar89._12_4_ * fVar127;
  auVar83._16_4_ = auVar89._16_4_ * fVar209;
  auVar83._20_4_ = auVar89._20_4_ * fVar210;
  auVar83._24_4_ = auVar89._24_4_ * fVar211;
  auVar83._28_4_ = auVar82._28_4_;
  auVar82._4_4_ = auVar92._4_4_ * fVar207;
  auVar82._0_4_ = auVar92._0_4_ * fVar162;
  auVar82._8_4_ = auVar92._8_4_ * fVar208;
  auVar82._12_4_ = auVar92._12_4_ * fVar127;
  auVar82._16_4_ = auVar92._16_4_ * fVar209;
  auVar82._20_4_ = auVar92._20_4_ * fVar210;
  auVar82._24_4_ = auVar92._24_4_ * fVar211;
  auVar82._28_4_ = auVar81._28_4_;
  auVar71 = vfmadd231ps_fma(auVar243._0_32_,auVar79,auVar85);
  auVar72 = vfmadd231ps_fma(auVar83,auVar79,auVar88);
  auVar73 = vfmadd231ps_fma(auVar82,auVar91,auVar79);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar98,auVar84);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar98,auVar87);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar90,auVar98);
  auVar99._4_4_ = fVar186;
  auVar99._0_4_ = fVar186;
  auVar99._8_4_ = fVar186;
  auVar99._12_4_ = fVar186;
  auVar99._16_4_ = fVar186;
  auVar99._20_4_ = fVar186;
  auVar99._24_4_ = fVar186;
  auVar99._28_4_ = fVar186;
  auVar83 = ZEXT1632(CONCAT412(fVar202 * auVar13._12_4_,
                               CONCAT48(fVar202 * auVar13._8_4_,
                                        CONCAT44(fVar202 * auVar13._4_4_,fVar186))));
  auVar82 = vpermps_avx512vl(auVar78,auVar83);
  auVar83 = vpermps_avx512vl(auVar80,auVar83);
  fVar202 = auVar83._0_4_;
  fVar162 = auVar83._4_4_;
  auVar78._4_4_ = fVar162 * auVar86._4_4_;
  auVar78._0_4_ = fVar202 * auVar86._0_4_;
  fVar207 = auVar83._8_4_;
  auVar78._8_4_ = fVar207 * auVar86._8_4_;
  fVar208 = auVar83._12_4_;
  auVar78._12_4_ = fVar208 * auVar86._12_4_;
  fVar127 = auVar83._16_4_;
  auVar78._16_4_ = fVar127 * auVar86._16_4_;
  fVar209 = auVar83._20_4_;
  auVar78._20_4_ = fVar209 * auVar86._20_4_;
  fVar210 = auVar83._24_4_;
  auVar78._24_4_ = fVar210 * auVar86._24_4_;
  auVar78._28_4_ = auVar86._28_4_;
  auVar94._0_4_ = auVar89._0_4_ * fVar202;
  auVar94._4_4_ = auVar89._4_4_ * fVar162;
  auVar94._8_4_ = auVar89._8_4_ * fVar207;
  auVar94._12_4_ = auVar89._12_4_ * fVar208;
  auVar94._16_4_ = auVar89._16_4_ * fVar127;
  auVar94._20_4_ = auVar89._20_4_ * fVar209;
  auVar94._24_4_ = auVar89._24_4_ * fVar210;
  auVar94._28_4_ = 0;
  auVar89._4_4_ = auVar92._4_4_ * fVar162;
  auVar89._0_4_ = auVar92._0_4_ * fVar202;
  auVar89._8_4_ = auVar92._8_4_ * fVar207;
  auVar89._12_4_ = auVar92._12_4_ * fVar208;
  auVar89._16_4_ = auVar92._16_4_ * fVar127;
  auVar89._20_4_ = auVar92._20_4_ * fVar209;
  auVar89._24_4_ = auVar92._24_4_ * fVar210;
  auVar89._28_4_ = auVar83._28_4_;
  auVar74 = vfmadd231ps_fma(auVar78,auVar82,auVar85);
  auVar69 = vfmadd231ps_fma(auVar94,auVar82,auVar88);
  auVar75 = vfmadd231ps_fma(auVar89,auVar82,auVar91);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar99,auVar84);
  auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar99,auVar87);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar99,auVar90);
  auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar243 = ZEXT3264(auVar84);
  vandps_avx512vl(ZEXT1632(auVar71),auVar84);
  auVar96._8_4_ = 0x219392ef;
  auVar96._0_8_ = 0x219392ef219392ef;
  auVar96._12_4_ = 0x219392ef;
  auVar96._16_4_ = 0x219392ef;
  auVar96._20_4_ = 0x219392ef;
  auVar96._24_4_ = 0x219392ef;
  auVar96._28_4_ = 0x219392ef;
  uVar67 = vcmpps_avx512vl(auVar84,auVar96,1);
  bVar66 = (bool)((byte)uVar67 & 1);
  auVar79._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar71._0_4_;
  bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar71._4_4_;
  bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar71._8_4_;
  bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar71._12_4_;
  auVar79._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * 0x219392ef;
  auVar79._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * 0x219392ef;
  auVar79._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * 0x219392ef;
  auVar79._28_4_ = (uint)(byte)(uVar67 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar72),auVar84);
  uVar67 = vcmpps_avx512vl(auVar79,auVar96,1);
  bVar66 = (bool)((byte)uVar67 & 1);
  auVar80._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar72._0_4_;
  bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar72._4_4_;
  bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar72._8_4_;
  bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar72._12_4_;
  auVar80._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * 0x219392ef;
  auVar80._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * 0x219392ef;
  auVar80._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * 0x219392ef;
  auVar80._28_4_ = (uint)(byte)(uVar67 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar73),auVar84);
  uVar67 = vcmpps_avx512vl(auVar80,auVar96,1);
  bVar66 = (bool)((byte)uVar67 & 1);
  auVar84._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar73._0_4_;
  bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar73._4_4_;
  bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar73._8_4_;
  bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar73._12_4_;
  auVar84._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * 0x219392ef;
  auVar84._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * 0x219392ef;
  auVar84._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * 0x219392ef;
  auVar84._28_4_ = (uint)(byte)(uVar67 >> 7) * 0x219392ef;
  auVar85 = vrcp14ps_avx512vl(auVar79);
  auVar97._8_4_ = 0x3f800000;
  auVar97._0_8_ = &DAT_3f8000003f800000;
  auVar97._12_4_ = 0x3f800000;
  auVar97._16_4_ = 0x3f800000;
  auVar97._20_4_ = 0x3f800000;
  auVar97._24_4_ = 0x3f800000;
  auVar97._28_4_ = 0x3f800000;
  auVar71 = vfnmadd213ps_fma(auVar79,auVar85,auVar97);
  auVar71 = vfmadd132ps_fma(ZEXT1632(auVar71),auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar80);
  auVar72 = vfnmadd213ps_fma(auVar80,auVar85,auVar97);
  auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar84);
  auVar73 = vfnmadd213ps_fma(auVar84,auVar85,auVar97);
  auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar85,auVar85);
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 7 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar74));
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 9 + 6));
  auVar90._4_4_ = auVar71._4_4_ * auVar84._4_4_;
  auVar90._0_4_ = auVar71._0_4_ * auVar84._0_4_;
  auVar90._8_4_ = auVar71._8_4_ * auVar84._8_4_;
  auVar90._12_4_ = auVar71._12_4_ * auVar84._12_4_;
  auVar90._16_4_ = auVar84._16_4_ * 0.0;
  auVar90._20_4_ = auVar84._20_4_ * 0.0;
  auVar90._24_4_ = auVar84._24_4_ * 0.0;
  auVar90._28_4_ = auVar84._28_4_;
  auVar84 = vcvtdq2ps_avx(auVar85);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar74));
  auVar95._0_4_ = auVar71._0_4_ * auVar84._0_4_;
  auVar95._4_4_ = auVar71._4_4_ * auVar84._4_4_;
  auVar95._8_4_ = auVar71._8_4_ * auVar84._8_4_;
  auVar95._12_4_ = auVar71._12_4_ * auVar84._12_4_;
  auVar95._16_4_ = auVar84._16_4_ * 0.0;
  auVar95._20_4_ = auVar84._20_4_ * 0.0;
  auVar95._24_4_ = auVar84._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar3 * 0x10 + 6));
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar3 * 0x10 + uVar60 * -2 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar69));
  auVar91._4_4_ = auVar72._4_4_ * auVar84._4_4_;
  auVar91._0_4_ = auVar72._0_4_ * auVar84._0_4_;
  auVar91._8_4_ = auVar72._8_4_ * auVar84._8_4_;
  auVar91._12_4_ = auVar72._12_4_ * auVar84._12_4_;
  auVar91._16_4_ = auVar84._16_4_ * 0.0;
  auVar91._20_4_ = auVar84._20_4_ * 0.0;
  auVar91._24_4_ = auVar84._24_4_ * 0.0;
  auVar91._28_4_ = auVar84._28_4_;
  auVar84 = vcvtdq2ps_avx(auVar85);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar69));
  auVar93._0_4_ = auVar72._0_4_ * auVar84._0_4_;
  auVar93._4_4_ = auVar72._4_4_ * auVar84._4_4_;
  auVar93._8_4_ = auVar72._8_4_ * auVar84._8_4_;
  auVar93._12_4_ = auVar72._12_4_ * auVar84._12_4_;
  auVar93._16_4_ = auVar84._16_4_ * 0.0;
  auVar93._20_4_ = auVar84._20_4_ * 0.0;
  auVar93._24_4_ = auVar84._24_4_ * 0.0;
  auVar93._28_4_ = 0;
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 + uVar60 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar75));
  auVar92._4_4_ = auVar84._4_4_ * auVar73._4_4_;
  auVar92._0_4_ = auVar84._0_4_ * auVar73._0_4_;
  auVar92._8_4_ = auVar84._8_4_ * auVar73._8_4_;
  auVar92._12_4_ = auVar84._12_4_ * auVar73._12_4_;
  auVar92._16_4_ = auVar84._16_4_ * 0.0;
  auVar92._20_4_ = auVar84._20_4_ * 0.0;
  auVar92._24_4_ = auVar84._24_4_ * 0.0;
  auVar92._28_4_ = auVar84._28_4_;
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 0x17 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar75));
  auVar81._0_4_ = auVar73._0_4_ * auVar84._0_4_;
  auVar81._4_4_ = auVar73._4_4_ * auVar84._4_4_;
  auVar81._8_4_ = auVar73._8_4_ * auVar84._8_4_;
  auVar81._12_4_ = auVar73._12_4_ * auVar84._12_4_;
  auVar81._16_4_ = auVar84._16_4_ * 0.0;
  auVar81._20_4_ = auVar84._20_4_ * 0.0;
  auVar81._24_4_ = auVar84._24_4_ * 0.0;
  auVar81._28_4_ = 0;
  auVar84 = vpminsd_avx2(auVar90,auVar95);
  auVar85 = vpminsd_avx2(auVar91,auVar93);
  auVar84 = vmaxps_avx(auVar84,auVar85);
  auVar85 = vpminsd_avx2(auVar92,auVar81);
  uVar201 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar86._4_4_ = uVar201;
  auVar86._0_4_ = uVar201;
  auVar86._8_4_ = uVar201;
  auVar86._12_4_ = uVar201;
  auVar86._16_4_ = uVar201;
  auVar86._20_4_ = uVar201;
  auVar86._24_4_ = uVar201;
  auVar86._28_4_ = uVar201;
  auVar85 = vmaxps_avx512vl(auVar85,auVar86);
  auVar84 = vmaxps_avx(auVar84,auVar85);
  auVar85._8_4_ = 0x3f7ffffa;
  auVar85._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar85._12_4_ = 0x3f7ffffa;
  auVar85._16_4_ = 0x3f7ffffa;
  auVar85._20_4_ = 0x3f7ffffa;
  auVar85._24_4_ = 0x3f7ffffa;
  auVar85._28_4_ = 0x3f7ffffa;
  local_200 = vmulps_avx512vl(auVar84,auVar85);
  auVar84 = vpmaxsd_avx2(auVar90,auVar95);
  auVar85 = vpmaxsd_avx2(auVar91,auVar93);
  auVar84 = vminps_avx(auVar84,auVar85);
  auVar85 = vpmaxsd_avx2(auVar92,auVar81);
  fVar202 = ray->tfar;
  auVar87._4_4_ = fVar202;
  auVar87._0_4_ = fVar202;
  auVar87._8_4_ = fVar202;
  auVar87._12_4_ = fVar202;
  auVar87._16_4_ = fVar202;
  auVar87._20_4_ = fVar202;
  auVar87._24_4_ = fVar202;
  auVar87._28_4_ = fVar202;
  auVar85 = vminps_avx512vl(auVar85,auVar87);
  auVar84 = vminps_avx(auVar84,auVar85);
  auVar88._8_4_ = 0x3f800003;
  auVar88._0_8_ = 0x3f8000033f800003;
  auVar88._12_4_ = 0x3f800003;
  auVar88._16_4_ = 0x3f800003;
  auVar88._20_4_ = 0x3f800003;
  auVar88._24_4_ = 0x3f800003;
  auVar88._28_4_ = 0x3f800003;
  auVar84 = vmulps_avx512vl(auVar84,auVar88);
  auVar85 = vpbroadcastd_avx512vl();
  uVar15 = vpcmpgtd_avx512vl(auVar85,_DAT_0205a920);
  uVar14 = vcmpps_avx512vl(local_200,auVar84,2);
  bVar64 = (byte)((byte)uVar14 & (byte)uVar15) == 0;
  bVar66 = !bVar64;
  if (bVar64) {
    return bVar66;
  }
  local_5d0 = (ulong)(byte)((byte)uVar14 & (byte)uVar15);
  local_5d8 = prim;
LAB_01ddf5b0:
  lVar62 = 0;
  for (uVar67 = local_5d0; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
    lVar62 = lVar62 + 1;
  }
  local_8a8 = (ulong)*(uint *)(prim + 2);
  local_8b0 = (ulong)*(uint *)(prim + lVar62 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[local_8a8].ptr;
  uVar67 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_8b0);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar62 = *(long *)&pGVar4[1].time_range.upper;
  auVar71 = *(undefined1 (*) [16])(lVar62 + (long)p_Var5 * uVar67);
  auVar72 = *(undefined1 (*) [16])(lVar62 + (uVar67 + 1) * (long)p_Var5);
  auVar73 = *(undefined1 (*) [16])(lVar62 + (uVar67 + 2) * (long)p_Var5);
  local_5d0 = local_5d0 - 1 & local_5d0;
  auVar74 = *(undefined1 (*) [16])(lVar62 + (uVar67 + 3) * (long)p_Var5);
  if (local_5d0 != 0) {
    uVar60 = local_5d0 - 1 & local_5d0;
    for (uVar67 = local_5d0; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
    }
    if (uVar60 != 0) {
      for (; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar197._0_4_ = auVar71._0_4_ + auVar72._0_4_ + auVar73._0_4_ + auVar74._0_4_;
  auVar197._4_4_ = auVar71._4_4_ + auVar72._4_4_ + auVar73._4_4_ + auVar74._4_4_;
  auVar197._8_4_ = auVar71._8_4_ + auVar72._8_4_ + auVar73._8_4_ + auVar74._8_4_;
  auVar197._12_4_ = auVar71._12_4_ + auVar72._12_4_ + auVar73._12_4_ + auVar74._12_4_;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar13._8_4_ = 0x3e800000;
  auVar13._0_8_ = 0x3e8000003e800000;
  auVar13._12_4_ = 0x3e800000;
  auVar69 = vmulps_avx512vl(auVar197,auVar13);
  auVar69 = vsubps_avx(auVar69,(undefined1  [16])aVar1);
  auVar69 = vdpps_avx(auVar69,(undefined1  [16])aVar2,0x7f);
  auVar75 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar215._4_12_ = ZEXT812(0) << 0x20;
  auVar215._0_4_ = auVar75._0_4_;
  auVar70 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar215);
  auVar75 = vfnmadd213ss_fma(auVar70,auVar75,ZEXT416(0x40000000));
  fVar202 = auVar69._0_4_ * auVar70._0_4_ * auVar75._0_4_;
  local_4f0 = ZEXT416((uint)fVar202);
  auVar198._4_4_ = fVar202;
  auVar198._0_4_ = fVar202;
  auVar198._8_4_ = fVar202;
  auVar198._12_4_ = fVar202;
  fStack_5b0 = fVar202;
  _local_5c0 = auVar198;
  fStack_5ac = fVar202;
  fStack_5a8 = fVar202;
  fStack_5a4 = fVar202;
  auVar69 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar198);
  auVar69 = vblendps_avx(auVar69,ZEXT816(0) << 0x40,8);
  auVar71 = vsubps_avx(auVar71,auVar69);
  auVar73 = vsubps_avx(auVar73,auVar69);
  uVar201 = *(undefined4 *)&(ray->dir).field_0;
  local_3c0._4_4_ = uVar201;
  local_3c0._0_4_ = uVar201;
  local_3c0._8_4_ = uVar201;
  local_3c0._12_4_ = uVar201;
  local_3c0._16_4_ = uVar201;
  local_3c0._20_4_ = uVar201;
  local_3c0._24_4_ = uVar201;
  local_3c0._28_4_ = uVar201;
  auVar217 = ZEXT3264(local_3c0);
  uVar201 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_380._4_4_ = uVar201;
  local_380._0_4_ = uVar201;
  local_380._8_4_ = uVar201;
  local_380._12_4_ = uVar201;
  local_380._16_4_ = uVar201;
  local_380._20_4_ = uVar201;
  local_380._24_4_ = uVar201;
  local_380._28_4_ = uVar201;
  local_2c0 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
  uStack_2bc = local_2c0;
  uStack_2b8 = local_2c0;
  uStack_2b4 = local_2c0;
  uStack_2b0 = local_2c0;
  uStack_2ac = local_2c0;
  uStack_2a8 = local_2c0;
  uStack_2a4 = local_2c0;
  auVar72 = vsubps_avx(auVar72,auVar69);
  auVar74 = vsubps_avx(auVar74,auVar69);
  uVar201 = auVar71._0_4_;
  local_1a0._4_4_ = uVar201;
  local_1a0._0_4_ = uVar201;
  local_1a0._8_4_ = uVar201;
  local_1a0._12_4_ = uVar201;
  local_1a0._16_4_ = uVar201;
  local_1a0._20_4_ = uVar201;
  local_1a0._24_4_ = uVar201;
  local_1a0._28_4_ = uVar201;
  auVar100._8_4_ = 1;
  auVar100._0_8_ = 0x100000001;
  auVar100._12_4_ = 1;
  auVar100._16_4_ = 1;
  auVar100._20_4_ = 1;
  auVar100._24_4_ = 1;
  auVar100._28_4_ = 1;
  local_400 = ZEXT1632(auVar71);
  local_6e0 = vpermps_avx2(auVar100,local_400);
  auVar220 = ZEXT3264(local_6e0);
  auVar101._8_4_ = 2;
  auVar101._0_8_ = 0x200000002;
  auVar101._12_4_ = 2;
  auVar101._16_4_ = 2;
  auVar101._20_4_ = 2;
  auVar101._24_4_ = 2;
  auVar101._28_4_ = 2;
  local_6c0 = vpermps_avx2(auVar101,local_400);
  auVar227 = ZEXT3264(local_6c0);
  auVar102._8_4_ = 3;
  auVar102._0_8_ = 0x300000003;
  auVar102._12_4_ = 3;
  auVar102._16_4_ = 3;
  auVar102._20_4_ = 3;
  auVar102._24_4_ = 3;
  auVar102._28_4_ = 3;
  local_700 = vpermps_avx2(auVar102,local_400);
  auVar229 = ZEXT3264(local_700);
  uVar201 = auVar72._0_4_;
  local_480._4_4_ = uVar201;
  local_480._0_4_ = uVar201;
  local_480._8_4_ = uVar201;
  local_480._12_4_ = uVar201;
  local_480._16_4_ = uVar201;
  local_480._20_4_ = uVar201;
  local_480._24_4_ = uVar201;
  local_480._28_4_ = uVar201;
  local_440 = ZEXT1632(auVar72);
  local_760 = vpermps_avx512vl(auVar100,local_440);
  auVar241 = ZEXT3264(local_760);
  local_780 = vpermps_avx512vl(auVar101,local_440);
  auVar242 = ZEXT3264(local_780);
  local_1c0 = vpermps_avx2(auVar102,local_440);
  local_7a0 = vbroadcastss_avx512vl(auVar73);
  auVar235 = ZEXT3264(local_7a0);
  local_420 = ZEXT1632(auVar73);
  local_7c0 = vpermps_avx512vl(auVar100,local_420);
  auVar236 = ZEXT3264(local_7c0);
  local_640 = vpermps_avx512vl(auVar101,local_420);
  auVar238 = ZEXT3264(local_640);
  local_660 = vpermps_avx512vl(auVar102,local_420);
  local_580 = vbroadcastss_avx512vl(auVar74);
  auVar244 = ZEXT3264(local_580);
  _local_460 = ZEXT1632(auVar74);
  local_7e0 = vpermps_avx512vl(auVar100,_local_460);
  auVar237 = ZEXT3264(local_7e0);
  local_680 = vpermps_avx512vl(auVar101,_local_460);
  auVar239 = ZEXT3264(local_680);
  local_6a0 = vpermps_avx512vl(auVar102,_local_460);
  auVar240 = ZEXT3264(local_6a0);
  auVar84 = vpermps_avx512vl(auVar101,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                         CONCAT48(aVar2.z * aVar2.z,
                                                                  CONCAT44(aVar2.y * aVar2.y,
                                                                           aVar2.x * aVar2.x)))));
  auVar84 = vfmadd231ps_avx512vl(auVar84,local_380,local_380);
  local_2e0 = vfmadd231ps_avx512vl(auVar84,local_3c0,local_3c0);
  vandps_avx512vl(local_2e0,auVar243._0_32_);
  local_7f8 = 1;
  local_5c8 = 0;
  bVar57 = 0;
  local_510 = ZEXT816(0x3f80000000000000);
  local_1e0 = local_2e0;
  do {
    auVar71 = vmovshdup_avx(local_510);
    fVar162 = local_510._0_4_;
    fVar202 = auVar71._0_4_ - fVar162;
    fVar127 = fVar202 * 0.04761905;
    local_860._4_4_ = fVar162;
    local_860._0_4_ = fVar162;
    fStack_858 = fVar162;
    fStack_854 = fVar162;
    register0x00001350 = fVar162;
    register0x00001354 = fVar162;
    register0x00001358 = fVar162;
    register0x0000135c = fVar162;
    local_5a0._4_4_ = fVar202;
    local_5a0._0_4_ = fVar202;
    fStack_598 = fVar202;
    fStack_594 = fVar202;
    register0x00001210 = fVar202;
    register0x00001214 = fVar202;
    register0x00001218 = fVar202;
    register0x0000121c = fVar202;
    auVar71 = vfmadd231ps_fma(_local_860,_local_5a0,_DAT_02020f20);
    auVar134._8_4_ = 0x3f800000;
    auVar134._0_8_ = &DAT_3f8000003f800000;
    auVar134._12_4_ = 0x3f800000;
    auVar134._16_4_ = 0x3f800000;
    auVar134._20_4_ = 0x3f800000;
    auVar134._24_4_ = 0x3f800000;
    auVar134._28_4_ = 0x3f800000;
    auVar84 = vsubps_avx(auVar134,ZEXT1632(auVar71));
    fVar202 = auVar71._0_4_;
    auVar178._0_4_ = local_480._0_4_ * fVar202;
    fVar162 = auVar71._4_4_;
    auVar178._4_4_ = local_480._4_4_ * fVar162;
    fVar207 = auVar71._8_4_;
    auVar178._8_4_ = local_480._8_4_ * fVar207;
    fVar208 = auVar71._12_4_;
    auVar178._12_4_ = local_480._12_4_ * fVar208;
    auVar178._16_4_ = local_480._16_4_ * 0.0;
    auVar178._20_4_ = local_480._20_4_ * 0.0;
    auVar178._24_4_ = local_480._24_4_ * 0.0;
    auVar178._28_4_ = 0;
    auVar87 = ZEXT1632(auVar71);
    auVar85 = vmulps_avx512vl(auVar241._0_32_,auVar87);
    auVar86 = vmulps_avx512vl(auVar242._0_32_,auVar87);
    auVar218._0_4_ = local_1c0._0_4_ * fVar202;
    auVar218._4_4_ = local_1c0._4_4_ * fVar162;
    auVar218._8_4_ = local_1c0._8_4_ * fVar207;
    auVar218._12_4_ = local_1c0._12_4_ * fVar208;
    auVar218._16_4_ = local_1c0._16_4_ * 0.0;
    auVar218._20_4_ = local_1c0._20_4_ * 0.0;
    auVar218._28_36_ = auVar217._28_36_;
    auVar218._24_4_ = local_1c0._24_4_ * 0.0;
    auVar72 = vfmadd231ps_fma(auVar178,auVar84,local_1a0);
    auVar73 = vfmadd231ps_fma(auVar85,auVar84,auVar220._0_32_);
    auVar74 = vfmadd231ps_fma(auVar86,auVar84,auVar227._0_32_);
    auVar69 = vfmadd231ps_fma(auVar218._0_32_,auVar84,auVar229._0_32_);
    auVar85 = vmulps_avx512vl(auVar235._0_32_,auVar87);
    auVar91 = ZEXT1632(auVar71);
    auVar86 = vmulps_avx512vl(auVar236._0_32_,auVar91);
    auVar87 = vmulps_avx512vl(auVar238._0_32_,auVar91);
    auVar88 = vmulps_avx512vl(local_660,auVar91);
    auVar75 = vfmadd231ps_fma(auVar85,auVar84,local_480);
    auVar85 = vfmadd231ps_avx512vl(auVar86,auVar84,auVar241._0_32_);
    auVar86 = vfmadd231ps_avx512vl(auVar87,auVar84,auVar242._0_32_);
    auVar70 = vfmadd231ps_fma(auVar88,auVar84,local_1c0);
    auVar87 = vmulps_avx512vl(auVar244._0_32_,auVar91);
    auVar88 = vmulps_avx512vl(auVar237._0_32_,auVar91);
    auVar89 = vmulps_avx512vl(auVar239._0_32_,auVar91);
    auVar90 = vmulps_avx512vl(auVar240._0_32_,auVar91);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar84,auVar235._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar84,auVar236._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar84,auVar238._0_32_);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar84,local_660);
    auVar91 = vmulps_avx512vl(auVar91,ZEXT1632(auVar75));
    auVar78 = ZEXT1632(auVar71);
    auVar92 = vmulps_avx512vl(auVar78,auVar85);
    auVar82 = vmulps_avx512vl(auVar78,auVar86);
    auVar83 = vmulps_avx512vl(auVar78,ZEXT1632(auVar70));
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar84,ZEXT1632(auVar72));
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar84,ZEXT1632(auVar73));
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar84,ZEXT1632(auVar74));
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar84,ZEXT1632(auVar69));
    auVar216._0_4_ = auVar87._0_4_ * fVar202;
    auVar216._4_4_ = auVar87._4_4_ * fVar162;
    auVar216._8_4_ = auVar87._8_4_ * fVar207;
    auVar216._12_4_ = auVar87._12_4_ * fVar208;
    auVar216._16_4_ = auVar87._16_4_ * 0.0;
    auVar216._20_4_ = auVar87._20_4_ * 0.0;
    auVar216._24_4_ = auVar87._24_4_ * 0.0;
    auVar216._28_4_ = 0;
    auVar34._4_4_ = auVar88._4_4_ * fVar162;
    auVar34._0_4_ = auVar88._0_4_ * fVar202;
    auVar34._8_4_ = auVar88._8_4_ * fVar207;
    auVar34._12_4_ = auVar88._12_4_ * fVar208;
    auVar34._16_4_ = auVar88._16_4_ * 0.0;
    auVar34._20_4_ = auVar88._20_4_ * 0.0;
    auVar34._24_4_ = auVar88._24_4_ * 0.0;
    auVar34._28_4_ = auVar87._28_4_;
    auVar35._4_4_ = auVar89._4_4_ * fVar162;
    auVar35._0_4_ = auVar89._0_4_ * fVar202;
    auVar35._8_4_ = auVar89._8_4_ * fVar207;
    auVar35._12_4_ = auVar89._12_4_ * fVar208;
    auVar35._16_4_ = auVar89._16_4_ * 0.0;
    auVar35._20_4_ = auVar89._20_4_ * 0.0;
    auVar35._24_4_ = auVar89._24_4_ * 0.0;
    auVar35._28_4_ = auVar88._28_4_;
    auVar87 = vmulps_avx512vl(auVar78,auVar90);
    auVar71 = vfmadd231ps_fma(auVar216,auVar84,ZEXT1632(auVar75));
    auVar72 = vfmadd231ps_fma(auVar34,auVar84,auVar85);
    auVar73 = vfmadd231ps_fma(auVar35,auVar84,auVar86);
    auVar74 = vfmadd231ps_fma(auVar87,auVar84,ZEXT1632(auVar70));
    auVar85 = vmulps_avx512vl(auVar78,ZEXT1632(auVar73));
    auVar88 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar71._12_4_ * fVar208,
                                            CONCAT48(auVar71._8_4_ * fVar207,
                                                     CONCAT44(auVar71._4_4_ * fVar162,
                                                              auVar71._0_4_ * fVar202)))),auVar84,
                         auVar91);
    auVar89 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar72._12_4_ * fVar208,
                                            CONCAT48(auVar72._8_4_ * fVar207,
                                                     CONCAT44(auVar72._4_4_ * fVar162,
                                                              auVar72._0_4_ * fVar202)))),auVar84,
                         auVar92);
    local_8a0 = vfmadd231ps_avx512vl(auVar85,auVar84,auVar82);
    auVar87 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar74._12_4_ * fVar208,
                                            CONCAT48(auVar74._8_4_ * fVar207,
                                                     CONCAT44(auVar74._4_4_ * fVar162,
                                                              auVar74._0_4_ * fVar202)))),auVar83,
                         auVar84);
    auVar84 = vsubps_avx512vl(ZEXT1632(auVar71),auVar91);
    auVar85 = vsubps_avx512vl(ZEXT1632(auVar72),auVar92);
    auVar90 = vsubps_avx512vl(ZEXT1632(auVar73),auVar82);
    auVar91 = vsubps_avx512vl(ZEXT1632(auVar74),auVar83);
    auVar36._4_4_ = fVar127 * auVar84._4_4_ * 3.0;
    auVar36._0_4_ = fVar127 * auVar84._0_4_ * 3.0;
    auVar36._8_4_ = fVar127 * auVar84._8_4_ * 3.0;
    auVar36._12_4_ = fVar127 * auVar84._12_4_ * 3.0;
    auVar36._16_4_ = fVar127 * auVar84._16_4_ * 3.0;
    auVar36._20_4_ = fVar127 * auVar84._20_4_ * 3.0;
    auVar36._24_4_ = fVar127 * auVar84._24_4_ * 3.0;
    auVar36._28_4_ = auVar86._28_4_;
    auVar230._0_4_ = auVar85._0_4_ * 3.0 * fVar127;
    auVar230._4_4_ = auVar85._4_4_ * 3.0 * fVar127;
    auVar230._8_4_ = auVar85._8_4_ * 3.0 * fVar127;
    auVar230._12_4_ = auVar85._12_4_ * 3.0 * fVar127;
    auVar230._16_4_ = auVar85._16_4_ * 3.0 * fVar127;
    auVar230._20_4_ = auVar85._20_4_ * 3.0 * fVar127;
    auVar230._24_4_ = auVar85._24_4_ * 3.0 * fVar127;
    auVar230._28_4_ = 0;
    auVar233._0_4_ = auVar90._0_4_ * 3.0 * fVar127;
    auVar233._4_4_ = auVar90._4_4_ * 3.0 * fVar127;
    auVar233._8_4_ = auVar90._8_4_ * 3.0 * fVar127;
    auVar233._12_4_ = auVar90._12_4_ * 3.0 * fVar127;
    auVar233._16_4_ = auVar90._16_4_ * 3.0 * fVar127;
    auVar233._20_4_ = auVar90._20_4_ * 3.0 * fVar127;
    auVar233._24_4_ = auVar90._24_4_ * 3.0 * fVar127;
    auVar233._28_4_ = 0;
    fVar202 = auVar91._0_4_ * 3.0 * fVar127;
    fVar162 = auVar91._4_4_ * 3.0 * fVar127;
    auVar37._4_4_ = fVar162;
    auVar37._0_4_ = fVar202;
    fVar207 = auVar91._8_4_ * 3.0 * fVar127;
    auVar37._8_4_ = fVar207;
    fVar208 = auVar91._12_4_ * 3.0 * fVar127;
    auVar37._12_4_ = fVar208;
    fVar209 = auVar91._16_4_ * 3.0 * fVar127;
    auVar37._16_4_ = fVar209;
    fVar210 = auVar91._20_4_ * 3.0 * fVar127;
    auVar37._20_4_ = fVar210;
    fVar211 = auVar91._24_4_ * 3.0 * fVar127;
    auVar37._24_4_ = fVar211;
    auVar37._28_4_ = fVar127;
    auVar71 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar90 = vpermt2ps_avx512vl(auVar88,_DAT_0205fd20,ZEXT1632(auVar71));
    auVar217 = ZEXT3264(auVar90);
    auVar91 = vpermt2ps_avx512vl(auVar89,_DAT_0205fd20,ZEXT1632(auVar71));
    auVar86 = ZEXT1632(auVar71);
    auVar92 = vpermt2ps_avx512vl(local_8a0,_DAT_0205fd20,auVar86);
    auVar212._0_4_ = auVar87._0_4_ + fVar202;
    auVar212._4_4_ = auVar87._4_4_ + fVar162;
    auVar212._8_4_ = auVar87._8_4_ + fVar207;
    auVar212._12_4_ = auVar87._12_4_ + fVar208;
    auVar212._16_4_ = auVar87._16_4_ + fVar209;
    auVar212._20_4_ = auVar87._20_4_ + fVar210;
    auVar212._24_4_ = auVar87._24_4_ + fVar211;
    auVar212._28_4_ = auVar87._28_4_ + fVar127;
    auVar84 = vmaxps_avx(auVar87,auVar212);
    auVar85 = vminps_avx(auVar87,auVar212);
    auVar82 = vpermt2ps_avx512vl(auVar87,_DAT_0205fd20,auVar86);
    auVar83 = vpermt2ps_avx512vl(auVar36,_DAT_0205fd20,auVar86);
    auVar78 = vpermt2ps_avx512vl(auVar230,_DAT_0205fd20,auVar86);
    auVar101 = ZEXT1632(auVar71);
    auVar79 = vpermt2ps_avx512vl(auVar233,_DAT_0205fd20,auVar101);
    auVar86 = vpermt2ps_avx512vl(auVar37,_DAT_0205fd20,auVar101);
    auVar80 = vsubps_avx512vl(auVar82,auVar86);
    auVar86 = vsubps_avx(auVar90,auVar88);
    auVar87 = vsubps_avx(auVar91,auVar89);
    auVar81 = vsubps_avx512vl(auVar92,local_8a0);
    auVar93 = vmulps_avx512vl(auVar87,auVar233);
    auVar93 = vfmsub231ps_avx512vl(auVar93,auVar230,auVar81);
    auVar94 = vmulps_avx512vl(auVar81,auVar36);
    auVar94 = vfmsub231ps_avx512vl(auVar94,auVar233,auVar86);
    auVar95 = vmulps_avx512vl(auVar86,auVar230);
    auVar95 = vfmsub231ps_avx512vl(auVar95,auVar36,auVar87);
    auVar95 = vmulps_avx512vl(auVar95,auVar95);
    auVar94 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar94);
    auVar93 = vfmadd231ps_avx512vl(auVar94,auVar93,auVar93);
    auVar94 = vmulps_avx512vl(auVar81,auVar81);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar87,auVar87);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar86,auVar86);
    auVar95 = vrcp14ps_avx512vl(auVar94);
    auVar96 = vfnmadd213ps_avx512vl(auVar95,auVar94,auVar134);
    auVar95 = vfmadd132ps_avx512vl(auVar96,auVar95,auVar95);
    auVar93 = vmulps_avx512vl(auVar93,auVar95);
    auVar96 = vmulps_avx512vl(auVar87,auVar79);
    auVar96 = vfmsub231ps_avx512vl(auVar96,auVar78,auVar81);
    auVar97 = vmulps_avx512vl(auVar81,auVar83);
    auVar97 = vfmsub231ps_avx512vl(auVar97,auVar79,auVar86);
    auVar98 = vmulps_avx512vl(auVar86,auVar78);
    auVar98 = vfmsub231ps_avx512vl(auVar98,auVar83,auVar87);
    auVar98 = vmulps_avx512vl(auVar98,auVar98);
    auVar97 = vfmadd231ps_avx512vl(auVar98,auVar97,auVar97);
    auVar96 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar96);
    auVar95 = vmulps_avx512vl(auVar96,auVar95);
    auVar93 = vmaxps_avx512vl(auVar93,auVar95);
    auVar93 = vsqrtps_avx512vl(auVar93);
    auVar95 = vmaxps_avx512vl(auVar80,auVar82);
    auVar84 = vmaxps_avx512vl(auVar84,auVar95);
    auVar84 = vaddps_avx512vl(auVar93,auVar84);
    auVar82 = vminps_avx512vl(auVar80,auVar82);
    auVar85 = vminps_avx512vl(auVar85,auVar82);
    auVar85 = vsubps_avx512vl(auVar85,auVar93);
    auVar105._8_4_ = 0x3f800002;
    auVar105._0_8_ = 0x3f8000023f800002;
    auVar105._12_4_ = 0x3f800002;
    auVar105._16_4_ = 0x3f800002;
    auVar105._20_4_ = 0x3f800002;
    auVar105._24_4_ = 0x3f800002;
    auVar105._28_4_ = 0x3f800002;
    auVar84 = vmulps_avx512vl(auVar84,auVar105);
    auVar106._8_4_ = 0x3f7ffffc;
    auVar106._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar106._12_4_ = 0x3f7ffffc;
    auVar106._16_4_ = 0x3f7ffffc;
    auVar106._20_4_ = 0x3f7ffffc;
    auVar106._24_4_ = 0x3f7ffffc;
    auVar106._28_4_ = 0x3f7ffffc;
    local_540 = vmulps_avx512vl(auVar85,auVar106);
    auVar84 = vmulps_avx512vl(auVar84,auVar84);
    auVar85 = vrsqrt14ps_avx512vl(auVar94);
    auVar107._8_4_ = 0xbf000000;
    auVar107._0_8_ = 0xbf000000bf000000;
    auVar107._12_4_ = 0xbf000000;
    auVar107._16_4_ = 0xbf000000;
    auVar107._20_4_ = 0xbf000000;
    auVar107._24_4_ = 0xbf000000;
    auVar107._28_4_ = 0xbf000000;
    auVar82 = vmulps_avx512vl(auVar94,auVar107);
    auVar38._4_4_ = auVar85._4_4_ * auVar82._4_4_;
    auVar38._0_4_ = auVar85._0_4_ * auVar82._0_4_;
    auVar38._8_4_ = auVar85._8_4_ * auVar82._8_4_;
    auVar38._12_4_ = auVar85._12_4_ * auVar82._12_4_;
    auVar38._16_4_ = auVar85._16_4_ * auVar82._16_4_;
    auVar38._20_4_ = auVar85._20_4_ * auVar82._20_4_;
    auVar38._24_4_ = auVar85._24_4_ * auVar82._24_4_;
    auVar38._28_4_ = auVar82._28_4_;
    auVar82 = vmulps_avx512vl(auVar85,auVar85);
    auVar82 = vmulps_avx512vl(auVar82,auVar38);
    auVar108._8_4_ = 0x3fc00000;
    auVar108._0_8_ = 0x3fc000003fc00000;
    auVar108._12_4_ = 0x3fc00000;
    auVar108._16_4_ = 0x3fc00000;
    auVar108._20_4_ = 0x3fc00000;
    auVar108._24_4_ = 0x3fc00000;
    auVar108._28_4_ = 0x3fc00000;
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar85,auVar108);
    auVar39._4_4_ = auVar82._4_4_ * auVar86._4_4_;
    auVar39._0_4_ = auVar82._0_4_ * auVar86._0_4_;
    auVar39._8_4_ = auVar82._8_4_ * auVar86._8_4_;
    auVar39._12_4_ = auVar82._12_4_ * auVar86._12_4_;
    auVar39._16_4_ = auVar82._16_4_ * auVar86._16_4_;
    auVar39._20_4_ = auVar82._20_4_ * auVar86._20_4_;
    auVar39._24_4_ = auVar82._24_4_ * auVar86._24_4_;
    auVar39._28_4_ = auVar85._28_4_;
    auVar85 = vmulps_avx512vl(auVar87,auVar82);
    auVar80 = vmulps_avx512vl(auVar81,auVar82);
    auVar93 = vsubps_avx512vl(auVar101,auVar88);
    auVar94 = vsubps_avx512vl(auVar101,auVar89);
    auVar95 = vsubps_avx512vl(auVar101,local_8a0);
    auVar53._4_4_ = uStack_2bc;
    auVar53._0_4_ = local_2c0;
    auVar53._8_4_ = uStack_2b8;
    auVar53._12_4_ = uStack_2b4;
    auVar53._16_4_ = uStack_2b0;
    auVar53._20_4_ = uStack_2ac;
    auVar53._24_4_ = uStack_2a8;
    auVar53._28_4_ = uStack_2a4;
    auVar96 = vmulps_avx512vl(auVar53,auVar95);
    auVar96 = vfmadd231ps_avx512vl(auVar96,local_380,auVar94);
    auVar96 = vfmadd231ps_avx512vl(auVar96,local_3c0,auVar93);
    auVar97 = vmulps_avx512vl(auVar95,auVar95);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar94);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,auVar93);
    auVar98 = vmulps_avx512vl(auVar53,auVar80);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar85,local_380);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar39,local_3c0);
    auVar80 = vmulps_avx512vl(auVar95,auVar80);
    auVar85 = vfmadd231ps_avx512vl(auVar80,auVar94,auVar85);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar93,auVar39);
    local_560 = vmulps_avx512vl(auVar98,auVar98);
    auVar80 = vsubps_avx512vl(local_1e0,local_560);
    auVar99 = vmulps_avx512vl(auVar98,auVar85);
    auVar96 = vsubps_avx512vl(auVar96,auVar99);
    auVar96 = vaddps_avx512vl(auVar96,auVar96);
    auVar99 = vmulps_avx512vl(auVar85,auVar85);
    local_880 = vsubps_avx512vl(auVar97,auVar99);
    auVar84 = vsubps_avx512vl(local_880,auVar84);
    auVar97 = vmulps_avx512vl(auVar96,auVar96);
    auVar109._8_4_ = 0x40800000;
    auVar109._0_8_ = 0x4080000040800000;
    auVar109._12_4_ = 0x40800000;
    auVar109._16_4_ = 0x40800000;
    auVar109._20_4_ = 0x40800000;
    auVar109._24_4_ = 0x40800000;
    auVar109._28_4_ = 0x40800000;
    auVar99 = vmulps_avx512vl(auVar80,auVar109);
    auVar100 = vmulps_avx512vl(auVar99,auVar84);
    auVar100 = vsubps_avx512vl(auVar97,auVar100);
    uVar67 = vcmpps_avx512vl(auVar100,auVar101,5);
    bVar59 = (byte)uVar67;
    if (bVar59 == 0) {
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar100 = vsqrtps_avx512vl(auVar100);
      auVar101 = vaddps_avx512vl(auVar80,auVar80);
      auVar102 = vrcp14ps_avx512vl(auVar101);
      auVar101 = vfnmadd213ps_avx512vl(auVar101,auVar102,auVar134);
      auVar101 = vfmadd132ps_avx512vl(auVar101,auVar102,auVar102);
      auVar24._8_4_ = 0x80000000;
      auVar24._0_8_ = 0x8000000080000000;
      auVar24._12_4_ = 0x80000000;
      auVar24._16_4_ = 0x80000000;
      auVar24._20_4_ = 0x80000000;
      auVar24._24_4_ = 0x80000000;
      auVar24._28_4_ = 0x80000000;
      auVar102 = vxorps_avx512vl(auVar96,auVar24);
      auVar102 = vsubps_avx512vl(auVar102,auVar100);
      auVar102 = vmulps_avx512vl(auVar102,auVar101);
      auVar100 = vsubps_avx512vl(auVar100,auVar96);
      auVar100 = vmulps_avx512vl(auVar100,auVar101);
      auVar101 = vfmadd213ps_avx512vl(auVar98,auVar102,auVar85);
      local_320 = vmulps_avx512vl(auVar82,auVar101);
      auVar101 = vfmadd213ps_avx512vl(auVar98,auVar100,auVar85);
      local_340 = vmulps_avx512vl(auVar82,auVar101);
      auVar135._8_4_ = 0x7f800000;
      auVar135._0_8_ = 0x7f8000007f800000;
      auVar135._12_4_ = 0x7f800000;
      auVar135._16_4_ = 0x7f800000;
      auVar135._20_4_ = 0x7f800000;
      auVar135._24_4_ = 0x7f800000;
      auVar135._28_4_ = 0x7f800000;
      auVar101 = vblendmps_avx512vl(auVar135,auVar102);
      auVar103._0_4_ =
           (uint)(bVar59 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar59 & 1) * local_340._0_4_;
      bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar103._4_4_ = (uint)bVar64 * auVar101._4_4_ | (uint)!bVar64 * local_340._4_4_;
      bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar103._8_4_ = (uint)bVar64 * auVar101._8_4_ | (uint)!bVar64 * local_340._8_4_;
      bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar103._12_4_ = (uint)bVar64 * auVar101._12_4_ | (uint)!bVar64 * local_340._12_4_;
      bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar103._16_4_ = (uint)bVar64 * auVar101._16_4_ | (uint)!bVar64 * local_340._16_4_;
      bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar103._20_4_ = (uint)bVar64 * auVar101._20_4_ | (uint)!bVar64 * local_340._20_4_;
      bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar103._24_4_ = (uint)bVar64 * auVar101._24_4_ | (uint)!bVar64 * local_340._24_4_;
      bVar64 = SUB81(uVar67 >> 7,0);
      auVar103._28_4_ = (uint)bVar64 * auVar101._28_4_ | (uint)!bVar64 * local_340._28_4_;
      auVar136._8_4_ = 0xff800000;
      auVar136._0_8_ = 0xff800000ff800000;
      auVar136._12_4_ = 0xff800000;
      auVar136._16_4_ = 0xff800000;
      auVar136._20_4_ = 0xff800000;
      auVar136._24_4_ = 0xff800000;
      auVar136._28_4_ = 0xff800000;
      auVar101 = vblendmps_avx512vl(auVar136,auVar100);
      auVar104._0_4_ =
           (uint)(bVar59 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar100._0_4_;
      bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar104._4_4_ = (uint)bVar64 * auVar101._4_4_ | (uint)!bVar64 * auVar100._4_4_;
      bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar104._8_4_ = (uint)bVar64 * auVar101._8_4_ | (uint)!bVar64 * auVar100._8_4_;
      bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar104._12_4_ = (uint)bVar64 * auVar101._12_4_ | (uint)!bVar64 * auVar100._12_4_;
      bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar104._16_4_ = (uint)bVar64 * auVar101._16_4_ | (uint)!bVar64 * auVar100._16_4_;
      bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar104._20_4_ = (uint)bVar64 * auVar101._20_4_ | (uint)!bVar64 * auVar100._20_4_;
      bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar104._24_4_ = (uint)bVar64 * auVar101._24_4_ | (uint)!bVar64 * auVar100._24_4_;
      bVar64 = SUB81(uVar67 >> 7,0);
      auVar104._28_4_ = (uint)bVar64 * auVar101._28_4_ | (uint)!bVar64 * auVar100._28_4_;
      auVar137._8_4_ = 0x7fffffff;
      auVar137._0_8_ = 0x7fffffff7fffffff;
      auVar137._12_4_ = 0x7fffffff;
      auVar137._16_4_ = 0x7fffffff;
      auVar137._20_4_ = 0x7fffffff;
      auVar137._24_4_ = 0x7fffffff;
      auVar137._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_560,auVar137);
      auVar100 = vmaxps_avx512vl(local_2e0,local_560);
      auVar25._8_4_ = 0x36000000;
      auVar25._0_8_ = 0x3600000036000000;
      auVar25._12_4_ = 0x36000000;
      auVar25._16_4_ = 0x36000000;
      auVar25._20_4_ = 0x36000000;
      auVar25._24_4_ = 0x36000000;
      auVar25._28_4_ = 0x36000000;
      auVar101 = vmulps_avx512vl(auVar100,auVar25);
      auVar100 = vandps_avx(auVar80,auVar137);
      uVar60 = vcmpps_avx512vl(auVar100,auVar101,1);
      uVar67 = uVar67 & uVar60;
      bVar61 = (byte)uVar67;
      if (bVar61 != 0) {
        uVar60 = vcmpps_avx512vl(auVar84,_DAT_02020f00,2);
        auVar161._8_4_ = 0xff800000;
        auVar161._0_8_ = 0xff800000ff800000;
        auVar161._12_4_ = 0xff800000;
        auVar161._16_4_ = 0xff800000;
        auVar161._20_4_ = 0xff800000;
        auVar161._24_4_ = 0xff800000;
        auVar161._28_4_ = 0xff800000;
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar101 = vblendmps_avx512vl(auVar84,auVar161);
        bVar58 = (byte)uVar60;
        uVar68 = (uint)(bVar58 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar100._0_4_;
        bVar64 = (bool)((byte)(uVar60 >> 1) & 1);
        uVar120 = (uint)bVar64 * auVar101._4_4_ | (uint)!bVar64 * auVar100._4_4_;
        bVar64 = (bool)((byte)(uVar60 >> 2) & 1);
        uVar121 = (uint)bVar64 * auVar101._8_4_ | (uint)!bVar64 * auVar100._8_4_;
        bVar64 = (bool)((byte)(uVar60 >> 3) & 1);
        uVar122 = (uint)bVar64 * auVar101._12_4_ | (uint)!bVar64 * auVar100._12_4_;
        bVar64 = (bool)((byte)(uVar60 >> 4) & 1);
        uVar123 = (uint)bVar64 * auVar101._16_4_ | (uint)!bVar64 * auVar100._16_4_;
        bVar64 = (bool)((byte)(uVar60 >> 5) & 1);
        uVar124 = (uint)bVar64 * auVar101._20_4_ | (uint)!bVar64 * auVar100._20_4_;
        bVar64 = (bool)((byte)(uVar60 >> 6) & 1);
        uVar125 = (uint)bVar64 * auVar101._24_4_ | (uint)!bVar64 * auVar100._24_4_;
        bVar64 = SUB81(uVar60 >> 7,0);
        uVar126 = (uint)bVar64 * auVar101._28_4_ | (uint)!bVar64 * auVar100._28_4_;
        auVar103._0_4_ = (bVar61 & 1) * uVar68 | !(bool)(bVar61 & 1) * auVar103._0_4_;
        bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar103._4_4_ = bVar64 * uVar120 | !bVar64 * auVar103._4_4_;
        bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar103._8_4_ = bVar64 * uVar121 | !bVar64 * auVar103._8_4_;
        bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar103._12_4_ = bVar64 * uVar122 | !bVar64 * auVar103._12_4_;
        bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar103._16_4_ = bVar64 * uVar123 | !bVar64 * auVar103._16_4_;
        bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar103._20_4_ = bVar64 * uVar124 | !bVar64 * auVar103._20_4_;
        bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar103._24_4_ = bVar64 * uVar125 | !bVar64 * auVar103._24_4_;
        bVar64 = SUB81(uVar67 >> 7,0);
        auVar103._28_4_ = bVar64 * uVar126 | !bVar64 * auVar103._28_4_;
        auVar84 = vblendmps_avx512vl(auVar161,auVar84);
        bVar64 = (bool)((byte)(uVar60 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar60 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar60 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar60 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar60 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar60 >> 6) & 1);
        bVar12 = SUB81(uVar60 >> 7,0);
        auVar104._0_4_ =
             (uint)(bVar61 & 1) *
             ((uint)(bVar58 & 1) * auVar84._0_4_ | !(bool)(bVar58 & 1) * uVar68) |
             !(bool)(bVar61 & 1) * auVar104._0_4_;
        bVar6 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar104._4_4_ =
             (uint)bVar6 * ((uint)bVar64 * auVar84._4_4_ | !bVar64 * uVar120) |
             !bVar6 * auVar104._4_4_;
        bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar104._8_4_ =
             (uint)bVar64 * ((uint)bVar7 * auVar84._8_4_ | !bVar7 * uVar121) |
             !bVar64 * auVar104._8_4_;
        bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar104._12_4_ =
             (uint)bVar64 * ((uint)bVar8 * auVar84._12_4_ | !bVar8 * uVar122) |
             !bVar64 * auVar104._12_4_;
        bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar104._16_4_ =
             (uint)bVar64 * ((uint)bVar9 * auVar84._16_4_ | !bVar9 * uVar123) |
             !bVar64 * auVar104._16_4_;
        bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar104._20_4_ =
             (uint)bVar64 * ((uint)bVar10 * auVar84._20_4_ | !bVar10 * uVar124) |
             !bVar64 * auVar104._20_4_;
        bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar104._24_4_ =
             (uint)bVar64 * ((uint)bVar11 * auVar84._24_4_ | !bVar11 * uVar125) |
             !bVar64 * auVar104._24_4_;
        bVar64 = SUB81(uVar67 >> 7,0);
        auVar104._28_4_ =
             (uint)bVar64 * ((uint)bVar12 * auVar84._28_4_ | !bVar12 * uVar126) |
             !bVar64 * auVar104._28_4_;
        bVar59 = (~bVar61 | bVar58) & bVar59;
      }
    }
    in_ZMM31 = ZEXT3264(auVar103);
    fVar202 = (float)local_5c0._0_4_;
    fVar162 = (float)local_5c0._4_4_;
    fVar207 = fStack_5b8;
    fVar208 = fStack_5b4;
    fVar127 = fStack_5b0;
    fVar209 = fStack_5ac;
    fVar210 = fStack_5a8;
    fVar211 = fStack_5a4;
    if ((bVar59 & 0x7f) == 0) {
      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar243 = ZEXT3264(auVar84);
LAB_01de01e5:
      auVar220 = ZEXT3264(local_6e0);
      auVar227 = ZEXT3264(local_6c0);
      auVar229 = ZEXT3264(local_700);
      auVar241 = ZEXT3264(local_760);
      auVar242 = ZEXT3264(local_780);
      auVar235 = ZEXT3264(local_7a0);
      auVar236 = ZEXT3264(local_7c0);
      auVar238 = ZEXT3264(local_640);
      auVar244 = ZEXT3264(local_580);
      auVar237 = ZEXT3264(local_7e0);
      auVar239 = ZEXT3264(local_680);
      auVar240 = ZEXT3264(local_6a0);
    }
    else {
      auVar71 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_4f0);
      auVar138._0_4_ = auVar71._0_4_;
      auVar138._4_4_ = auVar138._0_4_;
      auVar138._8_4_ = auVar138._0_4_;
      auVar138._12_4_ = auVar138._0_4_;
      auVar138._16_4_ = auVar138._0_4_;
      auVar138._20_4_ = auVar138._0_4_;
      auVar138._24_4_ = auVar138._0_4_;
      auVar138._28_4_ = auVar138._0_4_;
      auVar84 = vmaxps_avx512vl(auVar138,auVar103);
      auVar71 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_4f0);
      auVar157._0_4_ = auVar71._0_4_;
      auVar157._4_4_ = auVar157._0_4_;
      auVar157._8_4_ = auVar157._0_4_;
      auVar157._12_4_ = auVar157._0_4_;
      auVar157._16_4_ = auVar157._0_4_;
      auVar157._20_4_ = auVar157._0_4_;
      auVar157._24_4_ = auVar157._0_4_;
      auVar157._28_4_ = auVar157._0_4_;
      auVar100 = vminps_avx512vl(auVar157,auVar104);
      auVar95 = vmulps_avx512vl(auVar95,auVar233);
      auVar94 = vfmadd213ps_avx512vl(auVar94,auVar230,auVar95);
      auVar93 = vfmadd213ps_avx512vl(auVar93,auVar36,auVar94);
      auVar54._4_4_ = uStack_2bc;
      auVar54._0_4_ = local_2c0;
      auVar54._8_4_ = uStack_2b8;
      auVar54._12_4_ = uStack_2b4;
      auVar54._16_4_ = uStack_2b0;
      auVar54._20_4_ = uStack_2ac;
      auVar54._24_4_ = uStack_2a8;
      auVar54._28_4_ = uStack_2a4;
      auVar94 = vmulps_avx512vl(auVar54,auVar233);
      auVar94 = vfmadd231ps_avx512vl(auVar94,local_380,auVar230);
      auVar94 = vfmadd231ps_avx512vl(auVar94,local_3c0,auVar36);
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar243 = ZEXT3264(auVar95);
      vandps_avx512vl(auVar94,auVar95);
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar14 = vcmpps_avx512vl(auVar95,auVar101,1);
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      in_ZMM31 = ZEXT3264(auVar102);
      auVar93 = vxorps_avx512vl(auVar93,auVar102);
      auVar105 = vrcp14ps_avx512vl(auVar94);
      auVar106 = vxorps_avx512vl(auVar94,auVar102);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar108 = vfnmadd213ps_avx512vl(auVar105,auVar94,auVar107);
      auVar108 = vfmadd132ps_avx512vl(auVar108,auVar105,auVar105);
      auVar93 = vmulps_avx512vl(auVar108,auVar93);
      uVar15 = vcmpps_avx512vl(auVar94,auVar106,1);
      bVar61 = (byte)uVar14 | (byte)uVar15;
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar109 = vblendmps_avx512vl(auVar93,auVar108);
      auVar110._0_4_ =
           (uint)(bVar61 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar105._0_4_;
      bVar64 = (bool)(bVar61 >> 1 & 1);
      auVar110._4_4_ = (uint)bVar64 * auVar109._4_4_ | (uint)!bVar64 * auVar105._4_4_;
      bVar64 = (bool)(bVar61 >> 2 & 1);
      auVar110._8_4_ = (uint)bVar64 * auVar109._8_4_ | (uint)!bVar64 * auVar105._8_4_;
      bVar64 = (bool)(bVar61 >> 3 & 1);
      auVar110._12_4_ = (uint)bVar64 * auVar109._12_4_ | (uint)!bVar64 * auVar105._12_4_;
      bVar64 = (bool)(bVar61 >> 4 & 1);
      auVar110._16_4_ = (uint)bVar64 * auVar109._16_4_ | (uint)!bVar64 * auVar105._16_4_;
      bVar64 = (bool)(bVar61 >> 5 & 1);
      auVar110._20_4_ = (uint)bVar64 * auVar109._20_4_ | (uint)!bVar64 * auVar105._20_4_;
      bVar64 = (bool)(bVar61 >> 6 & 1);
      auVar110._24_4_ = (uint)bVar64 * auVar109._24_4_ | (uint)!bVar64 * auVar105._24_4_;
      auVar110._28_4_ =
           (uint)(bVar61 >> 7) * auVar109._28_4_ | (uint)!(bool)(bVar61 >> 7) * auVar105._28_4_;
      auVar84 = vmaxps_avx(auVar84,auVar110);
      uVar15 = vcmpps_avx512vl(auVar94,auVar106,6);
      bVar61 = (byte)uVar14 | (byte)uVar15;
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar111._0_4_ =
           (uint)(bVar61 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar93._0_4_;
      bVar64 = (bool)(bVar61 >> 1 & 1);
      auVar111._4_4_ = (uint)bVar64 * auVar94._4_4_ | (uint)!bVar64 * auVar93._4_4_;
      bVar64 = (bool)(bVar61 >> 2 & 1);
      auVar111._8_4_ = (uint)bVar64 * auVar94._8_4_ | (uint)!bVar64 * auVar93._8_4_;
      bVar64 = (bool)(bVar61 >> 3 & 1);
      auVar111._12_4_ = (uint)bVar64 * auVar94._12_4_ | (uint)!bVar64 * auVar93._12_4_;
      bVar64 = (bool)(bVar61 >> 4 & 1);
      auVar111._16_4_ = (uint)bVar64 * auVar94._16_4_ | (uint)!bVar64 * auVar93._16_4_;
      bVar64 = (bool)(bVar61 >> 5 & 1);
      auVar111._20_4_ = (uint)bVar64 * auVar94._20_4_ | (uint)!bVar64 * auVar93._20_4_;
      bVar64 = (bool)(bVar61 >> 6 & 1);
      auVar111._24_4_ = (uint)bVar64 * auVar94._24_4_ | (uint)!bVar64 * auVar93._24_4_;
      auVar111._28_4_ =
           (uint)(bVar61 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar61 >> 7) * auVar93._28_4_;
      auVar93 = vminps_avx(auVar100,auVar111);
      auVar90 = vsubps_avx(ZEXT832(0) << 0x20,auVar90);
      auVar91 = vsubps_avx(ZEXT832(0) << 0x20,auVar91);
      auVar100 = ZEXT832(0) << 0x20;
      auVar92 = vsubps_avx(auVar100,auVar92);
      auVar40._4_4_ = auVar92._4_4_ * auVar79._4_4_;
      auVar40._0_4_ = auVar92._0_4_ * auVar79._0_4_;
      auVar40._8_4_ = auVar92._8_4_ * auVar79._8_4_;
      auVar40._12_4_ = auVar92._12_4_ * auVar79._12_4_;
      auVar40._16_4_ = auVar92._16_4_ * auVar79._16_4_;
      auVar40._20_4_ = auVar92._20_4_ * auVar79._20_4_;
      auVar40._24_4_ = auVar92._24_4_ * auVar79._24_4_;
      auVar40._28_4_ = auVar92._28_4_;
      auVar91 = vfnmsub231ps_avx512vl(auVar40,auVar78,auVar91);
      auVar90 = vfnmadd231ps_avx512vl(auVar91,auVar83,auVar90);
      auVar91 = vmulps_avx512vl(auVar54,auVar79);
      auVar91 = vfnmsub231ps_avx512vl(auVar91,local_380,auVar78);
      auVar91 = vfnmadd231ps_avx512vl(auVar91,local_3c0,auVar83);
      vandps_avx512vl(auVar91,auVar95);
      uVar14 = vcmpps_avx512vl(auVar91,auVar101,1);
      auVar90 = vxorps_avx512vl(auVar90,auVar102);
      auVar92 = vrcp14ps_avx512vl(auVar91);
      auVar83 = vxorps_avx512vl(auVar91,auVar102);
      auVar79 = vfnmadd213ps_avx512vl(auVar92,auVar91,auVar107);
      auVar71 = vfmadd132ps_fma(auVar79,auVar92,auVar92);
      fVar186 = auVar71._0_4_ * auVar90._0_4_;
      fVar221 = auVar71._4_4_ * auVar90._4_4_;
      auVar41._4_4_ = fVar221;
      auVar41._0_4_ = fVar186;
      fVar222 = auVar71._8_4_ * auVar90._8_4_;
      auVar41._8_4_ = fVar222;
      fVar223 = auVar71._12_4_ * auVar90._12_4_;
      auVar41._12_4_ = fVar223;
      fVar224 = auVar90._16_4_ * 0.0;
      auVar41._16_4_ = fVar224;
      fVar225 = auVar90._20_4_ * 0.0;
      auVar41._20_4_ = fVar225;
      fVar226 = auVar90._24_4_ * 0.0;
      auVar41._24_4_ = fVar226;
      auVar41._28_4_ = auVar90._28_4_;
      uVar15 = vcmpps_avx512vl(auVar91,auVar83,1);
      bVar61 = (byte)uVar14 | (byte)uVar15;
      auVar79 = vblendmps_avx512vl(auVar41,auVar108);
      auVar112._0_4_ =
           (uint)(bVar61 & 1) * auVar79._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar92._0_4_;
      bVar64 = (bool)(bVar61 >> 1 & 1);
      auVar112._4_4_ = (uint)bVar64 * auVar79._4_4_ | (uint)!bVar64 * auVar92._4_4_;
      bVar64 = (bool)(bVar61 >> 2 & 1);
      auVar112._8_4_ = (uint)bVar64 * auVar79._8_4_ | (uint)!bVar64 * auVar92._8_4_;
      bVar64 = (bool)(bVar61 >> 3 & 1);
      auVar112._12_4_ = (uint)bVar64 * auVar79._12_4_ | (uint)!bVar64 * auVar92._12_4_;
      bVar64 = (bool)(bVar61 >> 4 & 1);
      auVar112._16_4_ = (uint)bVar64 * auVar79._16_4_ | (uint)!bVar64 * auVar92._16_4_;
      bVar64 = (bool)(bVar61 >> 5 & 1);
      auVar112._20_4_ = (uint)bVar64 * auVar79._20_4_ | (uint)!bVar64 * auVar92._20_4_;
      bVar64 = (bool)(bVar61 >> 6 & 1);
      auVar112._24_4_ = (uint)bVar64 * auVar79._24_4_ | (uint)!bVar64 * auVar92._24_4_;
      auVar112._28_4_ =
           (uint)(bVar61 >> 7) * auVar79._28_4_ | (uint)!(bool)(bVar61 >> 7) * auVar92._28_4_;
      _local_3e0 = vmaxps_avx(auVar84,auVar112);
      uVar15 = vcmpps_avx512vl(auVar91,auVar83,6);
      bVar61 = (byte)uVar14 | (byte)uVar15;
      auVar113._0_4_ = (uint)(bVar61 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar61 & 1) * (int)fVar186
      ;
      bVar64 = (bool)(bVar61 >> 1 & 1);
      auVar113._4_4_ = (uint)bVar64 * auVar94._4_4_ | (uint)!bVar64 * (int)fVar221;
      bVar64 = (bool)(bVar61 >> 2 & 1);
      auVar113._8_4_ = (uint)bVar64 * auVar94._8_4_ | (uint)!bVar64 * (int)fVar222;
      bVar64 = (bool)(bVar61 >> 3 & 1);
      auVar113._12_4_ = (uint)bVar64 * auVar94._12_4_ | (uint)!bVar64 * (int)fVar223;
      bVar64 = (bool)(bVar61 >> 4 & 1);
      auVar113._16_4_ = (uint)bVar64 * auVar94._16_4_ | (uint)!bVar64 * (int)fVar224;
      bVar64 = (bool)(bVar61 >> 5 & 1);
      auVar113._20_4_ = (uint)bVar64 * auVar94._20_4_ | (uint)!bVar64 * (int)fVar225;
      bVar64 = (bool)(bVar61 >> 6 & 1);
      auVar113._24_4_ = (uint)bVar64 * auVar94._24_4_ | (uint)!bVar64 * (int)fVar226;
      auVar113._28_4_ =
           (uint)(bVar61 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar61 >> 7) * auVar90._28_4_;
      local_240 = vminps_avx(auVar93,auVar113);
      auVar217 = ZEXT3264(local_240);
      uVar14 = vcmpps_avx512vl(_local_3e0,local_240,2);
      bVar59 = bVar59 & 0x7f & (byte)uVar14;
      if (bVar59 == 0) goto LAB_01de01e5;
      auVar84 = vmaxps_avx(auVar100,local_540);
      auVar90 = vminps_avx512vl(local_320,auVar107);
      auVar48 = ZEXT412(0);
      auVar91 = ZEXT1232(auVar48) << 0x20;
      auVar90 = vmaxps_avx(auVar90,ZEXT1232(auVar48) << 0x20);
      auVar92 = vminps_avx512vl(local_340,auVar107);
      auVar42._4_4_ = (auVar90._4_4_ + 1.0) * 0.125;
      auVar42._0_4_ = (auVar90._0_4_ + 0.0) * 0.125;
      auVar42._8_4_ = (auVar90._8_4_ + 2.0) * 0.125;
      auVar42._12_4_ = (auVar90._12_4_ + 3.0) * 0.125;
      auVar42._16_4_ = (auVar90._16_4_ + 4.0) * 0.125;
      auVar42._20_4_ = (auVar90._20_4_ + 5.0) * 0.125;
      auVar42._24_4_ = (auVar90._24_4_ + 6.0) * 0.125;
      auVar42._28_4_ = auVar90._28_4_ + 7.0;
      local_320 = vfmadd213ps_avx512vl(auVar42,_local_5a0,_local_860);
      auVar90 = vmaxps_avx(auVar92,ZEXT1232(auVar48) << 0x20);
      auVar43._4_4_ = (auVar90._4_4_ + 1.0) * 0.125;
      auVar43._0_4_ = (auVar90._0_4_ + 0.0) * 0.125;
      auVar43._8_4_ = (auVar90._8_4_ + 2.0) * 0.125;
      auVar43._12_4_ = (auVar90._12_4_ + 3.0) * 0.125;
      auVar43._16_4_ = (auVar90._16_4_ + 4.0) * 0.125;
      auVar43._20_4_ = (auVar90._20_4_ + 5.0) * 0.125;
      auVar43._24_4_ = (auVar90._24_4_ + 6.0) * 0.125;
      auVar43._28_4_ = auVar90._28_4_ + 7.0;
      local_340 = vfmadd213ps_avx512vl(auVar43,_local_5a0,_local_860);
      auVar44._4_4_ = auVar84._4_4_ * auVar84._4_4_;
      auVar44._0_4_ = auVar84._0_4_ * auVar84._0_4_;
      auVar44._8_4_ = auVar84._8_4_ * auVar84._8_4_;
      auVar44._12_4_ = auVar84._12_4_ * auVar84._12_4_;
      auVar44._16_4_ = auVar84._16_4_ * auVar84._16_4_;
      auVar44._20_4_ = auVar84._20_4_ * auVar84._20_4_;
      auVar44._24_4_ = auVar84._24_4_ * auVar84._24_4_;
      auVar44._28_4_ = local_340._28_4_;
      auVar84 = vsubps_avx(local_880,auVar44);
      auVar90 = vmulps_avx512vl(auVar99,auVar84);
      auVar90 = vsubps_avx512vl(auVar97,auVar90);
      uVar14 = vcmpps_avx512vl(auVar90,ZEXT1232(auVar48) << 0x20,5);
      bVar61 = (byte)uVar14;
      auVar239 = ZEXT3264(local_680);
      auVar240 = ZEXT3264(local_6a0);
      if (bVar61 == 0) {
        auVar85 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar220 = ZEXT864(0) << 0x20;
        auVar90 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar92 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar219 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar114._8_4_ = 0x7f800000;
        auVar114._0_8_ = 0x7f8000007f800000;
        auVar114._12_4_ = 0x7f800000;
        auVar114._16_4_ = 0x7f800000;
        auVar114._20_4_ = 0x7f800000;
        auVar114._24_4_ = 0x7f800000;
        auVar114._28_4_ = 0x7f800000;
        auVar115._8_4_ = 0xff800000;
        auVar115._0_8_ = 0xff800000ff800000;
        auVar115._12_4_ = 0xff800000;
        auVar115._16_4_ = 0xff800000;
        auVar115._20_4_ = 0xff800000;
        auVar115._24_4_ = 0xff800000;
        auVar115._28_4_ = 0xff800000;
      }
      else {
        auVar72 = vxorps_avx512vl(auVar78._0_16_,auVar78._0_16_);
        uVar67 = vcmpps_avx512vl(auVar90,auVar100,5);
        auVar90 = vsqrtps_avx(auVar90);
        auVar158._0_4_ = auVar80._0_4_ + auVar80._0_4_;
        auVar158._4_4_ = auVar80._4_4_ + auVar80._4_4_;
        auVar158._8_4_ = auVar80._8_4_ + auVar80._8_4_;
        auVar158._12_4_ = auVar80._12_4_ + auVar80._12_4_;
        auVar158._16_4_ = auVar80._16_4_ + auVar80._16_4_;
        auVar158._20_4_ = auVar80._20_4_ + auVar80._20_4_;
        auVar158._24_4_ = auVar80._24_4_ + auVar80._24_4_;
        auVar158._28_4_ = auVar80._28_4_ + auVar80._28_4_;
        auVar91 = vrcp14ps_avx512vl(auVar158);
        auVar92 = vfnmadd213ps_avx512vl(auVar158,auVar91,auVar107);
        auVar71 = vfmadd132ps_fma(auVar92,auVar91,auVar91);
        auVar26._8_4_ = 0x80000000;
        auVar26._0_8_ = 0x8000000080000000;
        auVar26._12_4_ = 0x80000000;
        auVar26._16_4_ = 0x80000000;
        auVar26._20_4_ = 0x80000000;
        auVar26._24_4_ = 0x80000000;
        auVar26._28_4_ = 0x80000000;
        auVar91 = vxorps_avx512vl(auVar96,auVar26);
        auVar91 = vsubps_avx(auVar91,auVar90);
        auVar45._4_4_ = auVar91._4_4_ * auVar71._4_4_;
        auVar45._0_4_ = auVar91._0_4_ * auVar71._0_4_;
        auVar45._8_4_ = auVar91._8_4_ * auVar71._8_4_;
        auVar45._12_4_ = auVar91._12_4_ * auVar71._12_4_;
        auVar45._16_4_ = auVar91._16_4_ * 0.0;
        auVar45._20_4_ = auVar91._20_4_ * 0.0;
        auVar45._24_4_ = auVar91._24_4_ * 0.0;
        auVar45._28_4_ = 0x3e000000;
        auVar90 = vsubps_avx512vl(auVar90,auVar96);
        auVar234._0_4_ = auVar90._0_4_ * auVar71._0_4_;
        auVar234._4_4_ = auVar90._4_4_ * auVar71._4_4_;
        auVar234._8_4_ = auVar90._8_4_ * auVar71._8_4_;
        auVar234._12_4_ = auVar90._12_4_ * auVar71._12_4_;
        auVar234._16_4_ = auVar90._16_4_ * 0.0;
        auVar234._20_4_ = auVar90._20_4_ * 0.0;
        auVar234._24_4_ = auVar90._24_4_ * 0.0;
        auVar234._28_4_ = 0;
        auVar90 = vfmadd213ps_avx512vl(auVar98,auVar45,auVar85);
        auVar46._4_4_ = auVar82._4_4_ * auVar90._4_4_;
        auVar46._0_4_ = auVar82._0_4_ * auVar90._0_4_;
        auVar46._8_4_ = auVar82._8_4_ * auVar90._8_4_;
        auVar46._12_4_ = auVar82._12_4_ * auVar90._12_4_;
        auVar46._16_4_ = auVar82._16_4_ * auVar90._16_4_;
        auVar46._20_4_ = auVar82._20_4_ * auVar90._20_4_;
        auVar46._24_4_ = auVar82._24_4_ * auVar90._24_4_;
        auVar46._28_4_ = auVar91._28_4_;
        auVar90 = vmulps_avx512vl(local_3c0,auVar45);
        auVar91 = vmulps_avx512vl(local_380,auVar45);
        auVar83 = vmulps_avx512vl(auVar54,auVar45);
        auVar92 = vfmadd213ps_avx512vl(auVar86,auVar46,auVar88);
        auVar90 = vsubps_avx512vl(auVar90,auVar92);
        auVar92 = vfmadd213ps_avx512vl(auVar87,auVar46,auVar89);
        auVar92 = vsubps_avx512vl(auVar91,auVar92);
        auVar71 = vfmadd213ps_fma(auVar46,auVar81,local_8a0);
        auVar91 = vsubps_avx(auVar83,ZEXT1632(auVar71));
        auVar219 = auVar91._0_28_;
        auVar85 = vfmadd213ps_avx512vl(auVar98,auVar234,auVar85);
        auVar82 = vmulps_avx512vl(auVar82,auVar85);
        auVar85 = vmulps_avx512vl(local_3c0,auVar234);
        auVar83 = vmulps_avx512vl(local_380,auVar234);
        auVar78 = vmulps_avx512vl(auVar54,auVar234);
        auVar71 = vfmadd213ps_fma(auVar86,auVar82,auVar88);
        auVar91 = vsubps_avx(auVar85,ZEXT1632(auVar71));
        auVar71 = vfmadd213ps_fma(auVar87,auVar82,auVar89);
        auVar85 = vsubps_avx512vl(auVar83,ZEXT1632(auVar71));
        auVar71 = vfmadd213ps_fma(auVar81,auVar82,local_8a0);
        auVar86 = vsubps_avx512vl(auVar78,ZEXT1632(auVar71));
        auVar220 = ZEXT3264(auVar86);
        auVar179._8_4_ = 0x7f800000;
        auVar179._0_8_ = 0x7f8000007f800000;
        auVar179._12_4_ = 0x7f800000;
        auVar179._16_4_ = 0x7f800000;
        auVar179._20_4_ = 0x7f800000;
        auVar179._24_4_ = 0x7f800000;
        auVar179._28_4_ = 0x7f800000;
        auVar86 = vblendmps_avx512vl(auVar179,auVar45);
        bVar64 = (bool)((byte)uVar67 & 1);
        auVar114._0_4_ = (uint)bVar64 * auVar86._0_4_ | (uint)!bVar64 * auVar88._0_4_;
        bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar114._4_4_ = (uint)bVar64 * auVar86._4_4_ | (uint)!bVar64 * auVar88._4_4_;
        bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar114._8_4_ = (uint)bVar64 * auVar86._8_4_ | (uint)!bVar64 * auVar88._8_4_;
        bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar114._12_4_ = (uint)bVar64 * auVar86._12_4_ | (uint)!bVar64 * auVar88._12_4_;
        bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar114._16_4_ = (uint)bVar64 * auVar86._16_4_ | (uint)!bVar64 * auVar88._16_4_;
        bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar114._20_4_ = (uint)bVar64 * auVar86._20_4_ | (uint)!bVar64 * auVar88._20_4_;
        bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar114._24_4_ = (uint)bVar64 * auVar86._24_4_ | (uint)!bVar64 * auVar88._24_4_;
        bVar64 = SUB81(uVar67 >> 7,0);
        auVar114._28_4_ = (uint)bVar64 * auVar86._28_4_ | (uint)!bVar64 * auVar88._28_4_;
        auVar180._8_4_ = 0xff800000;
        auVar180._0_8_ = 0xff800000ff800000;
        auVar180._12_4_ = 0xff800000;
        auVar180._16_4_ = 0xff800000;
        auVar180._20_4_ = 0xff800000;
        auVar180._24_4_ = 0xff800000;
        auVar180._28_4_ = 0xff800000;
        auVar86 = vblendmps_avx512vl(auVar180,auVar234);
        bVar64 = (bool)((byte)uVar67 & 1);
        auVar115._0_4_ = (uint)bVar64 * auVar86._0_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar64 * auVar86._4_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar64 * auVar86._8_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar64 * auVar86._12_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar115._16_4_ = (uint)bVar64 * auVar86._16_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar115._20_4_ = (uint)bVar64 * auVar86._20_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar115._24_4_ = (uint)bVar64 * auVar86._24_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = SUB81(uVar67 >> 7,0);
        auVar115._28_4_ = (uint)bVar64 * auVar86._28_4_ | (uint)!bVar64 * -0x800000;
        vandps_avx512vl(auVar95,local_560);
        auVar86 = vmaxps_avx(local_2e0,auVar115);
        auVar27._8_4_ = 0x36000000;
        auVar27._0_8_ = 0x3600000036000000;
        auVar27._12_4_ = 0x36000000;
        auVar27._16_4_ = 0x36000000;
        auVar27._20_4_ = 0x36000000;
        auVar27._24_4_ = 0x36000000;
        auVar27._28_4_ = 0x36000000;
        auVar86 = vmulps_avx512vl(auVar86,auVar27);
        vandps_avx512vl(auVar80,auVar95);
        uVar60 = vcmpps_avx512vl(auVar86,auVar86,1);
        uVar67 = uVar67 & uVar60;
        bVar58 = (byte)uVar67;
        if (bVar58 != 0) {
          uVar60 = vcmpps_avx512vl(auVar84,ZEXT1632(auVar72),2);
          auVar213._8_4_ = 0xff800000;
          auVar213._0_8_ = 0xff800000ff800000;
          auVar213._12_4_ = 0xff800000;
          auVar213._16_4_ = 0xff800000;
          auVar213._20_4_ = 0xff800000;
          auVar213._24_4_ = 0xff800000;
          auVar213._28_4_ = 0xff800000;
          auVar228._8_4_ = 0x7f800000;
          auVar228._0_8_ = 0x7f8000007f800000;
          auVar228._12_4_ = 0x7f800000;
          auVar228._16_4_ = 0x7f800000;
          auVar228._20_4_ = 0x7f800000;
          auVar228._24_4_ = 0x7f800000;
          auVar228._28_4_ = 0x7f800000;
          auVar84 = vblendmps_avx512vl(auVar228,auVar213);
          bVar55 = (byte)uVar60;
          uVar68 = (uint)(bVar55 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar86._0_4_;
          bVar64 = (bool)((byte)(uVar60 >> 1) & 1);
          uVar120 = (uint)bVar64 * auVar84._4_4_ | (uint)!bVar64 * auVar86._4_4_;
          bVar64 = (bool)((byte)(uVar60 >> 2) & 1);
          uVar121 = (uint)bVar64 * auVar84._8_4_ | (uint)!bVar64 * auVar86._8_4_;
          bVar64 = (bool)((byte)(uVar60 >> 3) & 1);
          uVar122 = (uint)bVar64 * auVar84._12_4_ | (uint)!bVar64 * auVar86._12_4_;
          bVar64 = (bool)((byte)(uVar60 >> 4) & 1);
          uVar123 = (uint)bVar64 * auVar84._16_4_ | (uint)!bVar64 * auVar86._16_4_;
          bVar64 = (bool)((byte)(uVar60 >> 5) & 1);
          uVar124 = (uint)bVar64 * auVar84._20_4_ | (uint)!bVar64 * auVar86._20_4_;
          bVar64 = (bool)((byte)(uVar60 >> 6) & 1);
          uVar125 = (uint)bVar64 * auVar84._24_4_ | (uint)!bVar64 * auVar86._24_4_;
          bVar64 = SUB81(uVar60 >> 7,0);
          uVar126 = (uint)bVar64 * auVar84._28_4_ | (uint)!bVar64 * auVar86._28_4_;
          auVar114._0_4_ = (bVar58 & 1) * uVar68 | !(bool)(bVar58 & 1) * auVar114._0_4_;
          bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar114._4_4_ = bVar64 * uVar120 | !bVar64 * auVar114._4_4_;
          bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar114._8_4_ = bVar64 * uVar121 | !bVar64 * auVar114._8_4_;
          bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar114._12_4_ = bVar64 * uVar122 | !bVar64 * auVar114._12_4_;
          bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar114._16_4_ = bVar64 * uVar123 | !bVar64 * auVar114._16_4_;
          bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar114._20_4_ = bVar64 * uVar124 | !bVar64 * auVar114._20_4_;
          bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar114._24_4_ = bVar64 * uVar125 | !bVar64 * auVar114._24_4_;
          bVar64 = SUB81(uVar67 >> 7,0);
          auVar114._28_4_ = bVar64 * uVar126 | !bVar64 * auVar114._28_4_;
          auVar84 = vblendmps_avx512vl(auVar213,auVar228);
          bVar64 = (bool)((byte)(uVar60 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar60 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar60 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar60 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar60 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar60 >> 6) & 1);
          bVar12 = SUB81(uVar60 >> 7,0);
          auVar115._0_4_ =
               (uint)(bVar58 & 1) *
               ((uint)(bVar55 & 1) * auVar84._0_4_ | !(bool)(bVar55 & 1) * uVar68) |
               !(bool)(bVar58 & 1) * auVar115._0_4_;
          bVar6 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar115._4_4_ =
               (uint)bVar6 * ((uint)bVar64 * auVar84._4_4_ | !bVar64 * uVar120) |
               !bVar6 * auVar115._4_4_;
          bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar115._8_4_ =
               (uint)bVar64 * ((uint)bVar7 * auVar84._8_4_ | !bVar7 * uVar121) |
               !bVar64 * auVar115._8_4_;
          bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar115._12_4_ =
               (uint)bVar64 * ((uint)bVar8 * auVar84._12_4_ | !bVar8 * uVar122) |
               !bVar64 * auVar115._12_4_;
          bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar115._16_4_ =
               (uint)bVar64 * ((uint)bVar9 * auVar84._16_4_ | !bVar9 * uVar123) |
               !bVar64 * auVar115._16_4_;
          bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar115._20_4_ =
               (uint)bVar64 * ((uint)bVar10 * auVar84._20_4_ | !bVar10 * uVar124) |
               !bVar64 * auVar115._20_4_;
          bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar115._24_4_ =
               (uint)bVar64 * ((uint)bVar11 * auVar84._24_4_ | !bVar11 * uVar125) |
               !bVar64 * auVar115._24_4_;
          bVar64 = SUB81(uVar67 >> 7,0);
          auVar115._28_4_ =
               (uint)bVar64 * ((uint)bVar12 * auVar84._28_4_ | !bVar12 * uVar126) |
               !bVar64 * auVar115._28_4_;
          bVar61 = (~bVar58 | bVar55) & bVar61;
        }
      }
      auVar241 = ZEXT3264(local_760);
      auVar242 = ZEXT3264(local_780);
      auVar235 = ZEXT3264(local_7a0);
      auVar236 = ZEXT3264(local_7c0);
      auVar237 = ZEXT3264(local_7e0);
      uVar201 = *(undefined4 *)&(ray->dir).field_0;
      auVar206._4_4_ = uVar201;
      auVar206._0_4_ = uVar201;
      auVar206._8_4_ = uVar201;
      auVar206._12_4_ = uVar201;
      auVar206._16_4_ = uVar201;
      auVar206._20_4_ = uVar201;
      auVar206._24_4_ = uVar201;
      auVar206._28_4_ = uVar201;
      uVar201 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar214._4_4_ = uVar201;
      auVar214._0_4_ = uVar201;
      auVar214._8_4_ = uVar201;
      auVar214._12_4_ = uVar201;
      auVar214._16_4_ = uVar201;
      auVar214._20_4_ = uVar201;
      auVar214._24_4_ = uVar201;
      auVar214._28_4_ = uVar201;
      fVar186 = (ray->dir).field_0.m128[2];
      auVar227._0_4_ = fVar186 * auVar220._0_4_;
      auVar227._4_4_ = fVar186 * auVar220._4_4_;
      auVar227._8_4_ = fVar186 * auVar220._8_4_;
      auVar227._12_4_ = fVar186 * auVar220._12_4_;
      auVar227._16_4_ = fVar186 * auVar220._16_4_;
      auVar227._20_4_ = fVar186 * auVar220._20_4_;
      auVar227._28_36_ = auVar220._28_36_;
      auVar227._24_4_ = fVar186 * auVar220._24_4_;
      auVar71 = vfmadd231ps_fma(auVar227._0_32_,auVar214,auVar85);
      auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar206,auVar91);
      _local_2a0 = _local_3e0;
      local_280 = vminps_avx(local_240,auVar114);
      vandps_avx512vl(ZEXT1632(auVar71),auVar95);
      _local_3a0 = vmaxps_avx(_local_3e0,auVar115);
      _local_260 = _local_3a0;
      auVar181._8_4_ = 0x3e99999a;
      auVar181._0_8_ = 0x3e99999a3e99999a;
      auVar181._12_4_ = 0x3e99999a;
      auVar181._16_4_ = 0x3e99999a;
      auVar181._20_4_ = 0x3e99999a;
      auVar181._24_4_ = 0x3e99999a;
      auVar181._28_4_ = 0x3e99999a;
      uVar14 = vcmpps_avx512vl(local_7e0,auVar181,1);
      local_7e4 = (undefined4)uVar14;
      uVar14 = vcmpps_avx512vl(_local_3e0,local_280,2);
      bVar58 = (byte)uVar14 & bVar59;
      uVar15 = vcmpps_avx512vl(_local_3a0,local_240,2);
      auVar238 = ZEXT3264(local_640);
      auVar244 = ZEXT3264(local_580);
      if ((bVar59 & ((byte)uVar15 | (byte)uVar14)) == 0) {
        auVar220 = ZEXT3264(local_6e0);
        auVar227 = ZEXT3264(local_6c0);
        auVar229 = ZEXT3264(local_700);
      }
      else {
        auVar47._4_4_ = auVar219._4_4_ * fVar186;
        auVar47._0_4_ = auVar219._0_4_ * fVar186;
        auVar47._8_4_ = auVar219._8_4_ * fVar186;
        auVar47._12_4_ = auVar219._12_4_ * fVar186;
        auVar47._16_4_ = auVar219._16_4_ * fVar186;
        auVar47._20_4_ = auVar219._20_4_ * fVar186;
        auVar47._24_4_ = auVar219._24_4_ * fVar186;
        auVar47._28_4_ = 0x3e99999a;
        auVar71 = vfmadd213ps_fma(auVar92,auVar214,auVar47);
        auVar71 = vfmadd213ps_fma(auVar90,auVar206,ZEXT1632(auVar71));
        vandps_avx512vl(ZEXT1632(auVar71),auVar95);
        uVar14 = vcmpps_avx512vl(local_580,auVar181,1);
        local_7ec = (uint)(byte)~bVar61;
        bVar61 = (byte)uVar14 | ~bVar61;
        auVar139._8_4_ = 2;
        auVar139._0_8_ = 0x200000002;
        auVar139._12_4_ = 2;
        auVar139._16_4_ = 2;
        auVar139._20_4_ = 2;
        auVar139._24_4_ = 2;
        auVar139._28_4_ = 2;
        auVar28._8_4_ = 3;
        auVar28._0_8_ = 0x300000003;
        auVar28._12_4_ = 3;
        auVar28._16_4_ = 3;
        auVar28._20_4_ = 3;
        auVar28._24_4_ = 3;
        auVar28._28_4_ = 3;
        auVar84 = vpblendmd_avx512vl(auVar139,auVar28);
        local_220._0_4_ = (uint)(bVar61 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar61 & 1) * 2;
        bVar64 = (bool)(bVar61 >> 1 & 1);
        local_220._4_4_ = (uint)bVar64 * auVar84._4_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar61 >> 2 & 1);
        local_220._8_4_ = (uint)bVar64 * auVar84._8_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar61 >> 3 & 1);
        local_220._12_4_ = (uint)bVar64 * auVar84._12_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar61 >> 4 & 1);
        local_220._16_4_ = (uint)bVar64 * auVar84._16_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar61 >> 5 & 1);
        local_220._20_4_ = (uint)bVar64 * auVar84._20_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar61 >> 6 & 1);
        local_220._24_4_ = (uint)bVar64 * auVar84._24_4_ | (uint)!bVar64 * 2;
        local_220._28_4_ = (uint)(bVar61 >> 7) * auVar84._28_4_ | (uint)!(bool)(bVar61 >> 7) * 2;
        local_300 = vpbroadcastd_avx512vl();
        uVar14 = vpcmpd_avx512vl(local_300,local_220,5);
        local_7e8 = (uint)bVar58;
        bVar58 = (byte)uVar14 & bVar58;
        auVar227 = ZEXT3264(local_6c0);
        if (bVar58 == 0) {
          auVar193._8_4_ = 0x7fffffff;
          auVar193._0_8_ = 0x7fffffff7fffffff;
          auVar193._12_4_ = 0x7fffffff;
          auVar220 = ZEXT3264(local_6e0);
          auVar229 = ZEXT3264(local_700);
        }
        else {
          auVar72 = vminps_avx(local_400._0_16_,local_440._0_16_);
          auVar71 = vmaxps_avx(local_400._0_16_,local_440._0_16_);
          auVar73 = vminps_avx(local_420._0_16_,local_460._0_16_);
          auVar74 = vminps_avx(auVar72,auVar73);
          auVar72 = vmaxps_avx(local_420._0_16_,local_460._0_16_);
          auVar73 = vmaxps_avx(auVar71,auVar72);
          auVar163._8_4_ = 0x7fffffff;
          auVar163._0_8_ = 0x7fffffff7fffffff;
          auVar163._12_4_ = 0x7fffffff;
          auVar71 = vandps_avx(auVar74,auVar163);
          auVar72 = vandps_avx(auVar73,auVar163);
          auVar71 = vmaxps_avx(auVar71,auVar72);
          auVar72 = vmovshdup_avx(auVar71);
          auVar72 = vmaxss_avx(auVar72,auVar71);
          auVar71 = vshufpd_avx(auVar71,auVar71,1);
          auVar71 = vmaxss_avx(auVar71,auVar72);
          fVar202 = auVar71._0_4_ * 1.9073486e-06;
          local_500 = vshufps_avx(auVar73,auVar73,0xff);
          local_360 = (float)local_5c0._0_4_ + (float)local_3e0._0_4_;
          fStack_35c = (float)local_5c0._4_4_ + (float)local_3e0._4_4_;
          fStack_358 = fStack_5b8 + fStack_3d8;
          fStack_354 = fStack_5b4 + fStack_3d4;
          fStack_350 = fStack_5b0 + fStack_3d0;
          fStack_34c = fStack_5ac + fStack_3cc;
          fStack_348 = fStack_5a8 + fStack_3c8;
          fStack_344 = fStack_5a4 + fStack_3c4;
          do {
            auVar86 = _local_860;
            auVar140._8_4_ = 0x7f800000;
            auVar140._0_8_ = 0x7f8000007f800000;
            auVar140._12_4_ = 0x7f800000;
            auVar140._16_4_ = 0x7f800000;
            auVar140._20_4_ = 0x7f800000;
            auVar140._24_4_ = 0x7f800000;
            auVar140._28_4_ = 0x7f800000;
            auVar84 = vblendmps_avx512vl(auVar140,_local_3e0);
            auVar116._0_4_ =
                 (uint)(bVar58 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar58 & 1) * 0x7f800000;
            bVar64 = (bool)(bVar58 >> 1 & 1);
            auVar116._4_4_ = (uint)bVar64 * auVar84._4_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar58 >> 2 & 1);
            auVar116._8_4_ = (uint)bVar64 * auVar84._8_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar58 >> 3 & 1);
            auVar116._12_4_ = (uint)bVar64 * auVar84._12_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar58 >> 4 & 1);
            auVar116._16_4_ = (uint)bVar64 * auVar84._16_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar58 >> 5 & 1);
            auVar116._20_4_ = (uint)bVar64 * auVar84._20_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar58 >> 6 & 1);
            auVar116._24_4_ = (uint)bVar64 * auVar84._24_4_ | (uint)!bVar64 * 0x7f800000;
            auVar116._28_4_ =
                 (uint)(bVar58 >> 7) * auVar84._28_4_ | (uint)!(bool)(bVar58 >> 7) * 0x7f800000;
            auVar84 = vshufps_avx(auVar116,auVar116,0xb1);
            auVar84 = vminps_avx(auVar116,auVar84);
            auVar85 = vshufpd_avx(auVar84,auVar84,5);
            auVar84 = vminps_avx(auVar84,auVar85);
            auVar85 = vpermpd_avx2(auVar84,0x4e);
            auVar84 = vminps_avx(auVar84,auVar85);
            uVar14 = vcmpps_avx512vl(auVar116,auVar84,0);
            bVar55 = (byte)uVar14 & bVar58;
            bVar61 = bVar58;
            if (bVar55 != 0) {
              bVar61 = bVar55;
            }
            iVar17 = 0;
            for (uVar68 = (uint)bVar61; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
              iVar17 = iVar17 + 1;
            }
            auVar217 = ZEXT464(*(uint *)(local_320 + (uint)(iVar17 << 2)));
            aVar1 = (ray->dir).field_0;
            local_560._0_16_ = (undefined1  [16])aVar1;
            auVar71 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar71._0_4_ < 0.0) {
              local_880._0_16_ = ZEXT416(*(uint *)(local_320 + (uint)(iVar17 << 2)));
              local_8a0._0_16_ = ZEXT416((uint)*(float *)(local_2a0 + (uint)(iVar17 << 2)));
              local_860[1] = 0;
              local_860[0] = bVar58;
              stack0xfffffffffffff7a2 = auVar86._2_30_;
              fVar207 = sqrtf(auVar71._0_4_);
              bVar58 = local_860[0];
              auVar217 = ZEXT1664(local_880._0_16_);
              fVar162 = (float)local_8a0._0_4_;
              uVar201 = local_8a0._4_4_;
              uVar231 = local_8a0._8_4_;
              uVar232 = local_8a0._12_4_;
            }
            else {
              auVar71 = vsqrtss_avx(auVar71,auVar71);
              fVar207 = auVar71._0_4_;
              fVar162 = *(float *)(local_2a0 + (uint)(iVar17 << 2));
              uVar201 = 0;
              uVar231 = 0;
              uVar232 = 0;
            }
            lVar62 = 5;
            do {
              auVar84 = local_8a0;
              auVar128._4_4_ = fVar162;
              auVar128._0_4_ = fVar162;
              auVar128._8_4_ = fVar162;
              auVar128._12_4_ = fVar162;
              auVar72 = vfmadd132ps_fma(auVar128,ZEXT816(0) << 0x40,local_560._0_16_);
              fVar127 = auVar217._0_4_;
              fVar208 = 1.0 - fVar127;
              auVar164._0_4_ = local_440._0_4_ * fVar127;
              auVar164._4_4_ = local_440._4_4_ * fVar127;
              auVar164._8_4_ = local_440._8_4_ * fVar127;
              auVar164._12_4_ = local_440._12_4_ * fVar127;
              local_490 = ZEXT416((uint)fVar208);
              auVar187._4_4_ = fVar208;
              auVar187._0_4_ = fVar208;
              auVar187._8_4_ = fVar208;
              auVar187._12_4_ = fVar208;
              auVar71 = vfmadd231ps_fma(auVar164,auVar187,local_400._0_16_);
              auVar191._0_4_ = local_420._0_4_ * fVar127;
              auVar191._4_4_ = local_420._4_4_ * fVar127;
              auVar191._8_4_ = local_420._8_4_ * fVar127;
              auVar191._12_4_ = local_420._12_4_ * fVar127;
              auVar73 = vfmadd231ps_fma(auVar191,auVar187,local_440._0_16_);
              auVar199._0_4_ = fVar127 * (float)local_460._0_4_;
              auVar199._4_4_ = fVar127 * (float)local_460._4_4_;
              auVar199._8_4_ = fVar127 * fStack_458;
              auVar199._12_4_ = fVar127 * fStack_454;
              auVar74 = vfmadd231ps_fma(auVar199,auVar187,local_420._0_16_);
              auVar203._0_4_ = fVar127 * auVar73._0_4_;
              auVar203._4_4_ = fVar127 * auVar73._4_4_;
              auVar203._8_4_ = fVar127 * auVar73._8_4_;
              auVar203._12_4_ = fVar127 * auVar73._12_4_;
              auVar71 = vfmadd231ps_fma(auVar203,auVar187,auVar71);
              auVar165._0_4_ = fVar127 * auVar74._0_4_;
              auVar165._4_4_ = fVar127 * auVar74._4_4_;
              auVar165._8_4_ = fVar127 * auVar74._8_4_;
              auVar165._12_4_ = fVar127 * auVar74._12_4_;
              auVar73 = vfmadd231ps_fma(auVar165,auVar187,auVar73);
              auVar192._0_4_ = fVar127 * auVar73._0_4_;
              auVar192._4_4_ = fVar127 * auVar73._4_4_;
              auVar192._8_4_ = fVar127 * auVar73._8_4_;
              auVar192._12_4_ = fVar127 * auVar73._12_4_;
              local_740 = vfmadd231ps_fma(auVar192,auVar71,auVar187);
              auVar71 = vsubps_avx(auVar73,auVar71);
              auVar18._8_4_ = 0x40400000;
              auVar18._0_8_ = 0x4040000040400000;
              auVar18._12_4_ = 0x40400000;
              auVar71 = vmulps_avx512vl(auVar71,auVar18);
              _local_860 = auVar71;
              auVar71 = vsubps_avx(auVar72,local_740);
              _local_5a0 = auVar71;
              auVar71 = vdpps_avx(auVar71,auVar71,0x7f);
              local_540._0_16_ = auVar71;
              local_880._0_16_ = auVar217._0_16_;
              local_8a0._4_4_ = uVar201;
              local_8a0._0_4_ = fVar162;
              local_8a0._8_4_ = uVar231;
              local_8a0._16_16_ = auVar84._16_16_;
              local_8a0._12_4_ = uVar232;
              if (auVar71._0_4_ < 0.0) {
                auVar217._0_4_ = sqrtf(auVar71._0_4_);
                auVar217._4_60_ = extraout_var;
                auVar71 = auVar217._0_16_;
              }
              else {
                auVar71 = vsqrtss_avx(auVar71,auVar71);
              }
              local_4a0 = vdpps_avx(_local_860,_local_860,0x7f);
              fVar208 = local_4a0._0_4_;
              auVar166._4_12_ = ZEXT812(0) << 0x20;
              auVar166._0_4_ = fVar208;
              local_810 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar166);
              fVar162 = local_810._0_4_ * 1.5;
              local_4b0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar166);
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar73 = vxorps_avx512vl(local_4a0,auVar19);
              auVar72 = vfnmadd213ss_fma(local_4b0,local_4a0,ZEXT416(0x40000000));
              uVar68 = auVar71._0_4_;
              if (fVar208 < auVar73._0_4_) {
                local_820._0_4_ = fVar162;
                local_830._0_4_ = fVar208 * -0.5;
                fVar127 = sqrtf(fVar208);
                auVar71 = ZEXT416(uVar68);
                fVar162 = (float)local_830._0_4_;
              }
              else {
                auVar73 = vsqrtss_avx(local_4a0,local_4a0);
                fVar127 = auVar73._0_4_;
                local_820._0_4_ = fVar162;
                fVar162 = fVar208 * -0.5;
              }
              fVar208 = local_810._0_4_;
              fVar162 = (float)local_820._0_4_ + fVar162 * fVar208 * fVar208 * fVar208;
              local_820._0_4_ = fVar162 * (float)local_860._0_4_;
              local_820._4_4_ = fVar162 * (float)local_860._4_4_;
              local_820._8_4_ = fVar162 * fStack_858;
              local_820._12_4_ = fVar162 * fStack_854;
              local_810 = vdpps_avx(local_820,_local_5a0,0x7f);
              auVar69 = vaddss_avx512f(auVar71,ZEXT416(0x3f800000));
              auVar129._0_4_ = local_810._0_4_ * local_810._0_4_;
              auVar129._4_4_ = local_810._4_4_ * local_810._4_4_;
              auVar129._8_4_ = local_810._8_4_ * local_810._8_4_;
              auVar129._12_4_ = local_810._12_4_ * local_810._12_4_;
              auVar73 = vsubps_avx(local_540._0_16_,auVar129);
              fVar208 = auVar73._0_4_;
              auVar145._4_12_ = ZEXT812(0) << 0x20;
              auVar145._0_4_ = fVar208;
              auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar145);
              auVar75 = vmulss_avx512f(auVar74,ZEXT416(0x3fc00000));
              in_ZMM31 = ZEXT1664(auVar75);
              local_830._0_4_ = fVar208 * -0.5;
              uVar65 = fVar208 == 0.0;
              uVar63 = fVar208 < 0.0;
              if ((bool)uVar63) {
                local_4d0._0_4_ = auVar75._0_4_;
                local_4e0 = fVar162;
                fStack_4dc = fVar162;
                fStack_4d8 = fVar162;
                fStack_4d4 = fVar162;
                local_4c0 = auVar74;
                fVar208 = sqrtf(fVar208);
                in_ZMM31 = ZEXT464((uint)local_4d0._0_4_);
                auVar71 = ZEXT416(uVar68);
                auVar69 = ZEXT416(auVar69._0_4_);
                auVar74 = local_4c0;
                fVar162 = local_4e0;
                fVar209 = fStack_4dc;
                fVar210 = fStack_4d8;
                fVar211 = fStack_4d4;
              }
              else {
                auVar73 = vsqrtss_avx(auVar73,auVar73);
                fVar208 = auVar73._0_4_;
                fVar209 = fVar162;
                fVar210 = fVar162;
                fVar211 = fVar162;
              }
              auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar220 = ZEXT3264(local_6e0);
              auVar227 = ZEXT3264(local_6c0);
              auVar229 = ZEXT3264(local_700);
              auVar238 = ZEXT3264(local_640);
              auVar237 = ZEXT3264(local_7e0);
              auVar239 = ZEXT3264(local_680);
              auVar240 = ZEXT3264(local_6a0);
              auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_,local_490);
              fVar186 = auVar73._0_4_ * 6.0;
              fVar221 = local_880._0_4_ * 6.0;
              auVar167._0_4_ = fVar221 * (float)local_460._0_4_;
              auVar167._4_4_ = fVar221 * (float)local_460._4_4_;
              auVar167._8_4_ = fVar221 * fStack_458;
              auVar167._12_4_ = fVar221 * fStack_454;
              auVar146._4_4_ = fVar186;
              auVar146._0_4_ = fVar186;
              auVar146._8_4_ = fVar186;
              auVar146._12_4_ = fVar186;
              auVar73 = vfmadd132ps_fma(auVar146,auVar167,local_420._0_16_);
              auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_490,local_880._0_16_);
              fVar186 = auVar75._0_4_ * 6.0;
              auVar168._4_4_ = fVar186;
              auVar168._0_4_ = fVar186;
              auVar168._8_4_ = fVar186;
              auVar168._12_4_ = fVar186;
              auVar73 = vfmadd132ps_fma(auVar168,auVar73,local_440._0_16_);
              fVar186 = local_490._0_4_ * 6.0;
              auVar147._4_4_ = fVar186;
              auVar147._0_4_ = fVar186;
              auVar147._8_4_ = fVar186;
              auVar147._12_4_ = fVar186;
              auVar73 = vfmadd132ps_fma(auVar147,auVar73,local_400._0_16_);
              auVar169._0_4_ = auVar73._0_4_ * (float)local_4a0._0_4_;
              auVar169._4_4_ = auVar73._4_4_ * (float)local_4a0._0_4_;
              auVar169._8_4_ = auVar73._8_4_ * (float)local_4a0._0_4_;
              auVar169._12_4_ = auVar73._12_4_ * (float)local_4a0._0_4_;
              auVar73 = vdpps_avx(_local_860,auVar73,0x7f);
              fVar186 = auVar73._0_4_;
              auVar148._0_4_ = local_860._0_4_ * fVar186;
              auVar148._4_4_ = local_860._4_4_ * fVar186;
              auVar148._8_4_ = local_860._8_4_ * fVar186;
              auVar148._12_4_ = local_860._12_4_ * fVar186;
              auVar73 = vsubps_avx(auVar169,auVar148);
              fVar186 = auVar72._0_4_ * (float)local_4b0._0_4_;
              auVar75 = vmaxss_avx(ZEXT416((uint)fVar202),
                                   ZEXT416((uint)((float)local_8a0._0_4_ * fVar207 * 1.9073486e-06))
                                  );
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar70 = vxorps_avx512vl(_local_860,auVar20);
              auVar170._0_4_ = fVar162 * auVar73._0_4_ * fVar186;
              auVar170._4_4_ = fVar209 * auVar73._4_4_ * fVar186;
              auVar170._8_4_ = fVar210 * auVar73._8_4_ * fVar186;
              auVar170._12_4_ = fVar211 * auVar73._12_4_ * fVar186;
              auVar72 = vdpps_avx(auVar70,local_820,0x7f);
              auVar73 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar202),auVar75);
              auVar71 = vdpps_avx(_local_5a0,auVar170,0x7f);
              vfmadd213ss_avx512f(auVar69,ZEXT416((uint)(fVar202 / fVar127)),auVar73);
              fVar162 = auVar72._0_4_ + auVar71._0_4_;
              auVar71 = vdpps_avx(local_560._0_16_,local_820,0x7f);
              auVar72 = vdpps_avx(_local_5a0,auVar70,0x7f);
              auVar73 = vmulss_avx512f(auVar74,ZEXT416((uint)local_830._0_4_));
              auVar74 = vmulss_avx512f(auVar74,auVar74);
              auVar70 = vaddss_avx512f(in_ZMM31._0_16_,
                                       ZEXT416((uint)(auVar73._0_4_ * auVar74._0_4_)));
              auVar73 = vdpps_avx(_local_5a0,local_560._0_16_,0x7f);
              auVar74 = vfnmadd231ss_fma(auVar72,local_810,ZEXT416((uint)fVar162));
              auVar69 = vfnmadd231ss_fma(auVar73,local_810,auVar71);
              auVar72 = vpermilps_avx(local_740,0xff);
              fVar208 = fVar208 - auVar72._0_4_;
              auVar72 = vshufps_avx(_local_860,_local_860,0xff);
              auVar73 = vfmsub213ss_fma(auVar74,auVar70,auVar72);
              fVar127 = auVar69._0_4_ * auVar70._0_4_;
              auVar74 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar73._0_4_)),
                                        ZEXT416((uint)fVar162),ZEXT416((uint)fVar127));
              fVar209 = auVar74._0_4_;
              fVar127 = local_880._0_4_ -
                        (local_810._0_4_ * (fVar127 / fVar209) - fVar208 * (auVar71._0_4_ / fVar209)
                        );
              auVar217 = ZEXT464((uint)fVar127);
              fVar162 = (float)local_8a0._0_4_ -
                        (fVar208 * (fVar162 / fVar209) - local_810._0_4_ * (auVar73._0_4_ / fVar209)
                        );
              auVar193._8_4_ = 0x7fffffff;
              auVar193._0_8_ = 0x7fffffff7fffffff;
              auVar193._12_4_ = 0x7fffffff;
              auVar71 = vandps_avx(local_810,auVar193);
              auVar71 = vucomiss_avx512f(auVar71);
              bVar64 = true;
              if ((bool)uVar63 || (bool)uVar65) {
LAB_01de0b68:
                uVar232 = 0;
                uVar231 = 0;
                uVar201 = 0;
                auVar235 = ZEXT3264(local_7a0);
                auVar243 = ZEXT3264(auVar84);
                auVar242 = ZEXT3264(local_780);
                auVar241 = ZEXT3264(local_760);
                auVar236 = ZEXT3264(local_7c0);
              }
              else {
                auVar71 = vaddss_avx512f(auVar75,auVar71);
                auVar73 = vfmadd231ss_fma(auVar71,local_500,ZEXT416(0x36000000));
                auVar71 = vandps_avx(ZEXT416((uint)fVar208),auVar193);
                if (auVar73._0_4_ <= auVar71._0_4_) goto LAB_01de0b68;
                fVar162 = fVar162 + (float)local_4f0._0_4_;
                uVar201 = 0;
                uVar231 = 0;
                uVar232 = 0;
                bVar64 = false;
                auVar243 = ZEXT3264(auVar84);
                if ((fVar162 < (ray->org).field_0.m128[3]) ||
                   (fVar208 = ray->tfar, fVar208 < fVar162)) {
                  unaff_R13 = 0;
                  goto LAB_01de0b68;
                }
                bVar64 = false;
                auVar241 = ZEXT3264(local_760);
                if (fVar127 < 0.0) {
                  unaff_R13 = 0;
                  goto LAB_01de0b68;
                }
                auVar242 = ZEXT3264(local_780);
                if (1.0 < fVar127) {
                  unaff_R13 = 0;
                  goto LAB_01de0b68;
                }
                auVar49._12_4_ = 0;
                auVar49._0_12_ = ZEXT812(0);
                auVar71 = vrsqrt14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)local_540._0_4_));
                fVar209 = auVar71._0_4_;
                pGVar4 = (context->scene->geometries).items[local_8a8].ptr;
                auVar235 = ZEXT3264(local_7a0);
                if ((pGVar4->mask & ray->mask) == 0) {
                  bVar64 = false;
                  unaff_R13 = 0;
                  goto LAB_01de0b68;
                }
                auVar236 = ZEXT3264(local_7c0);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  unaff_R13 = 1;
                }
                else {
                  fVar209 = fVar209 * 1.5 +
                            (float)local_540._0_4_ * -0.5 * fVar209 * fVar209 * fVar209;
                  auVar149._0_4_ = fVar209 * (float)local_5a0._0_4_;
                  auVar149._4_4_ = fVar209 * (float)local_5a0._4_4_;
                  auVar149._8_4_ = fVar209 * fStack_598;
                  auVar149._12_4_ = fVar209 * fStack_594;
                  auVar74 = vfmadd213ps_fma(auVar72,auVar149,_local_860);
                  auVar71 = vshufps_avx(auVar149,auVar149,0xc9);
                  auVar72 = vshufps_avx(_local_860,_local_860,0xc9);
                  auVar150._0_4_ = auVar149._0_4_ * auVar72._0_4_;
                  auVar150._4_4_ = auVar149._4_4_ * auVar72._4_4_;
                  auVar150._8_4_ = auVar149._8_4_ * auVar72._8_4_;
                  auVar150._12_4_ = auVar149._12_4_ * auVar72._12_4_;
                  auVar73 = vfmsub231ps_fma(auVar150,_local_860,auVar71);
                  auVar71 = vshufps_avx(auVar73,auVar73,0xc9);
                  auVar72 = vshufps_avx(auVar74,auVar74,0xc9);
                  auVar73 = vshufps_avx(auVar73,auVar73,0xd2);
                  auVar130._0_4_ = auVar74._0_4_ * auVar73._0_4_;
                  auVar130._4_4_ = auVar74._4_4_ * auVar73._4_4_;
                  auVar130._8_4_ = auVar74._8_4_ * auVar73._8_4_;
                  auVar130._12_4_ = auVar74._12_4_ * auVar73._12_4_;
                  auVar72 = vfmsub231ps_fma(auVar130,auVar71,auVar72);
                  auVar71 = vshufps_avx(auVar72,auVar72,0xe9);
                  local_610 = vmovlps_avx(auVar71);
                  local_608 = auVar72._0_4_;
                  local_600 = 0;
                  local_5fc = (undefined4)local_8b0;
                  local_5f8 = (undefined4)local_8a8;
                  local_5f4 = context->user->instID[0];
                  local_5f0 = context->user->instPrimID[0];
                  ray->tfar = fVar162;
                  local_8b4 = -1;
                  local_730.valid = &local_8b4;
                  local_730.geometryUserPtr = pGVar4->userPtr;
                  local_730.context = context->user;
                  local_730.hit = (RTCHitN *)&local_610;
                  local_730.N = 1;
                  local_880._0_16_ = ZEXT416((uint)fVar127);
                  local_8a0._0_16_ = ZEXT416((uint)fVar162);
                  local_740._0_4_ = fVar208;
                  local_730.ray = (RTCRayN *)ray;
                  local_604 = fVar127;
                  if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01de0d71:
                    p_Var5 = context->args->filter;
                    if (p_Var5 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var5)(&local_730);
                        auVar217 = ZEXT1664(local_880._0_16_);
                        auVar240 = ZEXT3264(local_6a0);
                        auVar239 = ZEXT3264(local_680);
                        auVar237 = ZEXT3264(local_7e0);
                        auVar238 = ZEXT3264(local_640);
                        auVar236 = ZEXT3264(local_7c0);
                        auVar235 = ZEXT3264(local_7a0);
                        auVar242 = ZEXT3264(local_780);
                        auVar241 = ZEXT3264(local_760);
                        auVar229 = ZEXT3264(local_700);
                        auVar227 = ZEXT3264(local_6c0);
                        auVar220 = ZEXT3264(local_6e0);
                        auVar193._8_4_ = 0x7fffffff;
                        auVar193._0_8_ = 0x7fffffff7fffffff;
                        auVar193._12_4_ = 0x7fffffff;
                        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar243 = ZEXT3264(auVar84);
                        fVar208 = (float)local_740._0_4_;
                        fVar162 = (float)local_8a0._0_4_;
                        uVar201 = local_8a0._4_4_;
                        uVar231 = local_8a0._8_4_;
                        uVar232 = local_8a0._12_4_;
                      }
                      if (*local_730.valid == 0) goto LAB_01de0e41;
                    }
                    unaff_R13 = 1;
                  }
                  else {
                    (*pGVar4->occlusionFilterN)(&local_730);
                    auVar217 = ZEXT1664(local_880._0_16_);
                    auVar240 = ZEXT3264(local_6a0);
                    auVar239 = ZEXT3264(local_680);
                    auVar237 = ZEXT3264(local_7e0);
                    auVar238 = ZEXT3264(local_640);
                    auVar236 = ZEXT3264(local_7c0);
                    auVar235 = ZEXT3264(local_7a0);
                    auVar242 = ZEXT3264(local_780);
                    auVar241 = ZEXT3264(local_760);
                    auVar229 = ZEXT3264(local_700);
                    auVar227 = ZEXT3264(local_6c0);
                    auVar220 = ZEXT3264(local_6e0);
                    auVar193._8_4_ = 0x7fffffff;
                    auVar193._0_8_ = 0x7fffffff7fffffff;
                    auVar193._12_4_ = 0x7fffffff;
                    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar243 = ZEXT3264(auVar84);
                    fVar208 = (float)local_740._0_4_;
                    fVar162 = (float)local_8a0._0_4_;
                    uVar201 = local_8a0._4_4_;
                    uVar231 = local_8a0._8_4_;
                    uVar232 = local_8a0._12_4_;
                    if (*local_730.valid != 0) goto LAB_01de0d71;
LAB_01de0e41:
                    unaff_R13 = 0;
                  }
                  if ((char)unaff_R13 == '\0') {
                    ray->tfar = fVar208;
                  }
                }
                bVar64 = false;
              }
              bVar61 = (byte)unaff_R13;
              if (!bVar64) goto LAB_01de0e64;
              lVar62 = lVar62 + -1;
            } while (lVar62 != 0);
            bVar61 = 0;
            auVar193._8_4_ = 0x7fffffff;
            auVar193._0_8_ = 0x7fffffff7fffffff;
            auVar193._12_4_ = 0x7fffffff;
LAB_01de0e64:
            unaff_R13 = (ulong)(bVar61 & 1);
            bVar57 = bVar57 | bVar61 & 1;
            auVar51._4_4_ = fStack_35c;
            auVar51._0_4_ = local_360;
            auVar51._8_4_ = fStack_358;
            auVar51._12_4_ = fStack_354;
            auVar51._16_4_ = fStack_350;
            auVar51._20_4_ = fStack_34c;
            auVar51._24_4_ = fStack_348;
            auVar51._28_4_ = fStack_344;
            fVar162 = ray->tfar;
            auVar29._4_4_ = fVar162;
            auVar29._0_4_ = fVar162;
            auVar29._8_4_ = fVar162;
            auVar29._12_4_ = fVar162;
            auVar29._16_4_ = fVar162;
            auVar29._20_4_ = fVar162;
            auVar29._24_4_ = fVar162;
            auVar29._28_4_ = fVar162;
            uVar14 = vcmpps_avx512vl(auVar51,auVar29,2);
            bVar58 = ~('\x01' << ((byte)iVar17 & 0x1f)) & bVar58 & (byte)uVar14;
          } while (bVar58 != 0);
        }
        auVar141._0_4_ = (float)local_5c0._0_4_ + (float)local_3a0._0_4_;
        auVar141._4_4_ = (float)local_5c0._4_4_ + (float)local_3a0._4_4_;
        auVar141._8_4_ = fStack_5b8 + fStack_398;
        auVar141._12_4_ = fStack_5b4 + fStack_394;
        auVar141._16_4_ = fStack_5b0 + fStack_390;
        auVar141._20_4_ = fStack_5ac + fStack_38c;
        auVar141._24_4_ = fStack_5a8 + fStack_388;
        auVar141._28_4_ = fStack_5a4 + fStack_384;
        fVar202 = ray->tfar;
        auVar30._4_4_ = fVar202;
        auVar30._0_4_ = fVar202;
        auVar30._8_4_ = fVar202;
        auVar30._12_4_ = fVar202;
        auVar30._16_4_ = fVar202;
        auVar30._20_4_ = fVar202;
        auVar30._24_4_ = fVar202;
        auVar30._28_4_ = fVar202;
        uVar14 = vcmpps_avx512vl(auVar141,auVar30,2);
        bVar61 = (byte)local_7e4 | (byte)local_7ec;
        bVar59 = (byte)uVar15 & bVar59 & (byte)uVar14;
        auVar142._8_4_ = 2;
        auVar142._0_8_ = 0x200000002;
        auVar142._12_4_ = 2;
        auVar142._16_4_ = 2;
        auVar142._20_4_ = 2;
        auVar142._24_4_ = 2;
        auVar142._28_4_ = 2;
        auVar31._8_4_ = 3;
        auVar31._0_8_ = 0x300000003;
        auVar31._12_4_ = 3;
        auVar31._16_4_ = 3;
        auVar31._20_4_ = 3;
        auVar31._24_4_ = 3;
        auVar31._28_4_ = 3;
        auVar84 = vpblendmd_avx512vl(auVar142,auVar31);
        local_3a0._0_4_ = (uint)(bVar61 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar61 & 1) * 2;
        bVar64 = (bool)(bVar61 >> 1 & 1);
        local_3a0._4_4_ = (uint)bVar64 * auVar84._4_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar61 >> 2 & 1);
        fStack_398 = (float)((uint)bVar64 * auVar84._8_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)(bVar61 >> 3 & 1);
        fStack_394 = (float)((uint)bVar64 * auVar84._12_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)(bVar61 >> 4 & 1);
        fStack_390 = (float)((uint)bVar64 * auVar84._16_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)(bVar61 >> 5 & 1);
        fStack_38c = (float)((uint)bVar64 * auVar84._20_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)(bVar61 >> 6 & 1);
        fStack_388 = (float)((uint)bVar64 * auVar84._24_4_ | (uint)!bVar64 * 2);
        fStack_384 = (float)((uint)(bVar61 >> 7) * auVar84._28_4_ | (uint)!(bool)(bVar61 >> 7) * 2);
        uVar14 = vpcmpd_avx512vl(_local_3a0,local_300,2);
        bVar61 = (byte)uVar14 & bVar59;
        if (bVar61 == 0) {
          auVar244 = ZEXT3264(local_580);
          fVar202 = (float)local_5c0._0_4_;
          fVar162 = (float)local_5c0._4_4_;
          fVar207 = fStack_5b8;
          fVar208 = fStack_5b4;
          fVar127 = fStack_5b0;
          fVar209 = fStack_5ac;
          fVar210 = fStack_5a8;
          fVar211 = fStack_5a4;
        }
        else {
          auVar72 = vminps_avx(local_400._0_16_,local_440._0_16_);
          auVar71 = vmaxps_avx(local_400._0_16_,local_440._0_16_);
          auVar73 = vminps_avx(local_420._0_16_,local_460._0_16_);
          auVar74 = vminps_avx(auVar72,auVar73);
          auVar72 = vmaxps_avx(local_420._0_16_,local_460._0_16_);
          auVar73 = vmaxps_avx(auVar71,auVar72);
          auVar71 = vandps_avx(auVar74,auVar193);
          auVar72 = vandps_avx(auVar73,auVar193);
          auVar71 = vmaxps_avx(auVar71,auVar72);
          auVar72 = vmovshdup_avx(auVar71);
          auVar72 = vmaxss_avx(auVar72,auVar71);
          auVar71 = vshufpd_avx(auVar71,auVar71,1);
          auVar71 = vmaxss_avx(auVar71,auVar72);
          fVar186 = auVar71._0_4_ * 1.9073486e-06;
          local_500 = vshufps_avx(auVar73,auVar73,0xff);
          _local_3e0 = _local_260;
          local_360 = (float)local_5c0._0_4_ + (float)local_260._0_4_;
          fStack_35c = (float)local_5c0._4_4_ + (float)local_260._4_4_;
          fStack_358 = fStack_5b8 + fStack_258;
          fStack_354 = fStack_5b4 + fStack_254;
          fStack_350 = fStack_5b0 + fStack_250;
          fStack_34c = fStack_5ac + fStack_24c;
          fStack_348 = fStack_5a8 + fStack_248;
          fStack_344 = fStack_5a4 + fStack_244;
          do {
            auVar86 = _local_860;
            auVar143._8_4_ = 0x7f800000;
            auVar143._0_8_ = 0x7f8000007f800000;
            auVar143._12_4_ = 0x7f800000;
            auVar143._16_4_ = 0x7f800000;
            auVar143._20_4_ = 0x7f800000;
            auVar143._24_4_ = 0x7f800000;
            auVar143._28_4_ = 0x7f800000;
            auVar84 = vblendmps_avx512vl(auVar143,_local_3e0);
            auVar117._0_4_ =
                 (uint)(bVar61 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar61 & 1) * 0x7f800000;
            bVar64 = (bool)(bVar61 >> 1 & 1);
            auVar117._4_4_ = (uint)bVar64 * auVar84._4_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar61 >> 2 & 1);
            auVar117._8_4_ = (uint)bVar64 * auVar84._8_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar61 >> 3 & 1);
            auVar117._12_4_ = (uint)bVar64 * auVar84._12_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar61 >> 4 & 1);
            auVar117._16_4_ = (uint)bVar64 * auVar84._16_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar61 >> 5 & 1);
            auVar117._20_4_ = (uint)bVar64 * auVar84._20_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar61 >> 6 & 1);
            auVar117._24_4_ = (uint)bVar64 * auVar84._24_4_ | (uint)!bVar64 * 0x7f800000;
            auVar117._28_4_ =
                 (uint)(bVar61 >> 7) * auVar84._28_4_ | (uint)!(bool)(bVar61 >> 7) * 0x7f800000;
            auVar84 = vshufps_avx(auVar117,auVar117,0xb1);
            auVar84 = vminps_avx(auVar117,auVar84);
            auVar85 = vshufpd_avx(auVar84,auVar84,5);
            auVar84 = vminps_avx(auVar84,auVar85);
            auVar85 = vpermpd_avx2(auVar84,0x4e);
            auVar84 = vminps_avx(auVar84,auVar85);
            uVar14 = vcmpps_avx512vl(auVar117,auVar84,0);
            bVar55 = (byte)uVar14 & bVar61;
            bVar58 = bVar61;
            if (bVar55 != 0) {
              bVar58 = bVar55;
            }
            iVar17 = 0;
            for (uVar68 = (uint)bVar58; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
              iVar17 = iVar17 + 1;
            }
            auVar217 = ZEXT464(*(uint *)(local_340 + (uint)(iVar17 << 2)));
            aVar1 = (ray->dir).field_0;
            local_560._0_16_ = (undefined1  [16])aVar1;
            auVar71 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar71._0_4_ < 0.0) {
              local_880._0_16_ = ZEXT416(*(uint *)(local_340 + (uint)(iVar17 << 2)));
              local_8a0._0_16_ = ZEXT416((uint)*(float *)(local_240 + (uint)(iVar17 << 2)));
              local_860[1] = 0;
              local_860[0] = bVar61;
              stack0xfffffffffffff7a2 = auVar86._2_30_;
              fVar222 = sqrtf(auVar71._0_4_);
              bVar61 = local_860[0];
              auVar217 = ZEXT1664(local_880._0_16_);
              fVar221 = (float)local_8a0._0_4_;
              uVar201 = local_8a0._4_4_;
              uVar231 = local_8a0._8_4_;
              uVar232 = local_8a0._12_4_;
            }
            else {
              auVar71 = vsqrtss_avx(auVar71,auVar71);
              fVar222 = auVar71._0_4_;
              fVar221 = *(float *)(local_240 + (uint)(iVar17 << 2));
              uVar201 = 0;
              uVar231 = 0;
              uVar232 = 0;
            }
            lVar62 = 5;
            do {
              auVar84 = local_8a0;
              auVar131._4_4_ = fVar221;
              auVar131._0_4_ = fVar221;
              auVar131._8_4_ = fVar221;
              auVar131._12_4_ = fVar221;
              auVar72 = vfmadd132ps_fma(auVar131,ZEXT816(0) << 0x40,local_560._0_16_);
              fVar162 = auVar217._0_4_;
              fVar202 = 1.0 - fVar162;
              auVar171._0_4_ = local_440._0_4_ * fVar162;
              auVar171._4_4_ = local_440._4_4_ * fVar162;
              auVar171._8_4_ = local_440._8_4_ * fVar162;
              auVar171._12_4_ = local_440._12_4_ * fVar162;
              local_490 = ZEXT416((uint)fVar202);
              auVar188._4_4_ = fVar202;
              auVar188._0_4_ = fVar202;
              auVar188._8_4_ = fVar202;
              auVar188._12_4_ = fVar202;
              auVar71 = vfmadd231ps_fma(auVar171,auVar188,local_400._0_16_);
              auVar194._0_4_ = local_420._0_4_ * fVar162;
              auVar194._4_4_ = local_420._4_4_ * fVar162;
              auVar194._8_4_ = local_420._8_4_ * fVar162;
              auVar194._12_4_ = local_420._12_4_ * fVar162;
              auVar73 = vfmadd231ps_fma(auVar194,auVar188,local_440._0_16_);
              auVar200._0_4_ = fVar162 * (float)local_460._0_4_;
              auVar200._4_4_ = fVar162 * (float)local_460._4_4_;
              auVar200._8_4_ = fVar162 * fStack_458;
              auVar200._12_4_ = fVar162 * fStack_454;
              auVar74 = vfmadd231ps_fma(auVar200,auVar188,local_420._0_16_);
              auVar204._0_4_ = fVar162 * auVar73._0_4_;
              auVar204._4_4_ = fVar162 * auVar73._4_4_;
              auVar204._8_4_ = fVar162 * auVar73._8_4_;
              auVar204._12_4_ = fVar162 * auVar73._12_4_;
              auVar71 = vfmadd231ps_fma(auVar204,auVar188,auVar71);
              auVar172._0_4_ = fVar162 * auVar74._0_4_;
              auVar172._4_4_ = fVar162 * auVar74._4_4_;
              auVar172._8_4_ = fVar162 * auVar74._8_4_;
              auVar172._12_4_ = fVar162 * auVar74._12_4_;
              auVar73 = vfmadd231ps_fma(auVar172,auVar188,auVar73);
              auVar195._0_4_ = fVar162 * auVar73._0_4_;
              auVar195._4_4_ = fVar162 * auVar73._4_4_;
              auVar195._8_4_ = fVar162 * auVar73._8_4_;
              auVar195._12_4_ = fVar162 * auVar73._12_4_;
              local_740 = vfmadd231ps_fma(auVar195,auVar71,auVar188);
              auVar71 = vsubps_avx(auVar73,auVar71);
              auVar21._8_4_ = 0x40400000;
              auVar21._0_8_ = 0x4040000040400000;
              auVar21._12_4_ = 0x40400000;
              auVar73 = vmulps_avx512vl(auVar71,auVar21);
              auVar71 = vsubps_avx(auVar72,local_740);
              _local_5a0 = auVar71;
              auVar71 = vdpps_avx(auVar71,auVar71,0x7f);
              _local_860 = auVar73;
              local_540._0_16_ = auVar71;
              local_880._0_16_ = auVar217._0_16_;
              local_8a0._4_4_ = uVar201;
              local_8a0._0_4_ = fVar221;
              local_8a0._8_4_ = uVar231;
              local_8a0._16_16_ = auVar84._16_16_;
              local_8a0._12_4_ = uVar232;
              if (auVar71._0_4_ < 0.0) {
                auVar220._0_4_ = sqrtf(auVar71._0_4_);
                auVar220._4_60_ = extraout_var_00;
                auVar71 = auVar220._0_16_;
                auVar73 = _local_860;
              }
              else {
                auVar71 = vsqrtss_avx(auVar71,auVar71);
              }
              local_4a0 = vdpps_avx(auVar73,auVar73,0x7f);
              fVar162 = local_4a0._0_4_;
              auVar173._4_12_ = ZEXT812(0) << 0x20;
              auVar173._0_4_ = fVar162;
              local_810 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar173);
              fVar202 = local_810._0_4_ * 1.5;
              local_4b0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar173);
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar74 = vxorps_avx512vl(local_4a0,auVar22);
              auVar72 = vfnmadd213ss_fma(local_4b0,local_4a0,ZEXT416(0x40000000));
              uVar68 = auVar71._0_4_;
              if (fVar162 < auVar74._0_4_) {
                local_820._0_4_ = fVar202;
                local_830._0_4_ = fVar162 * -0.5;
                auVar229._0_4_ = sqrtf(fVar162);
                auVar229._4_60_ = extraout_var_01;
                auVar71 = ZEXT416(uVar68);
                auVar74 = auVar229._0_16_;
                fVar202 = (float)local_820._0_4_;
                auVar73 = _local_860;
              }
              else {
                auVar74 = vsqrtss_avx512f(local_4a0,local_4a0);
                local_830._0_4_ = fVar162 * -0.5;
              }
              fVar162 = local_810._0_4_;
              fVar202 = fVar202 + (float)local_830._0_4_ * fVar162 * fVar162 * fVar162;
              local_830._0_4_ = auVar73._0_4_ * fVar202;
              local_830._4_4_ = auVar73._4_4_ * fVar202;
              local_830._8_4_ = auVar73._8_4_ * fVar202;
              local_830._12_4_ = auVar73._12_4_ * fVar202;
              local_810 = vdpps_avx(_local_5a0,local_830,0x7f);
              auVar70 = vaddss_avx512f(auVar71,ZEXT416(0x3f800000));
              auVar132._0_4_ = local_810._0_4_ * local_810._0_4_;
              auVar132._4_4_ = local_810._4_4_ * local_810._4_4_;
              auVar132._8_4_ = local_810._8_4_ * local_810._8_4_;
              auVar132._12_4_ = local_810._12_4_ * local_810._12_4_;
              auVar69 = vsubps_avx(local_540._0_16_,auVar132);
              fVar162 = auVar69._0_4_;
              auVar151._4_12_ = ZEXT812(0) << 0x20;
              auVar151._0_4_ = fVar162;
              auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar151);
              auVar76 = vmulss_avx512f(auVar75,ZEXT416(0x3fc00000));
              local_820._0_4_ = auVar76._0_4_;
              uVar65 = fVar162 == 0.0;
              uVar63 = fVar162 < 0.0;
              if ((bool)uVar63) {
                local_4c0._0_4_ = auVar74._0_4_;
                local_4e0 = fVar202;
                fStack_4dc = fVar202;
                fStack_4d8 = fVar202;
                fStack_4d4 = fVar202;
                local_4d0 = auVar75;
                fVar207 = sqrtf(fVar162);
                auVar74 = ZEXT416((uint)local_4c0._0_4_);
                auVar71 = ZEXT416(uVar68);
                auVar70 = ZEXT416(auVar70._0_4_);
                auVar73 = _local_860;
                auVar75 = local_4d0;
                fVar202 = local_4e0;
                fVar208 = fStack_4dc;
                fVar127 = fStack_4d8;
                fVar209 = fStack_4d4;
              }
              else {
                auVar69 = vsqrtss_avx(auVar69,auVar69);
                fVar207 = auVar69._0_4_;
                fVar208 = fVar202;
                fVar127 = fVar202;
                fVar209 = fVar202;
              }
              in_ZMM31 = ZEXT1664(auVar75);
              auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar220 = ZEXT3264(local_6e0);
              auVar227 = ZEXT3264(local_6c0);
              auVar229 = ZEXT3264(local_700);
              auVar241 = ZEXT3264(local_760);
              auVar242 = ZEXT3264(local_780);
              auVar235 = ZEXT3264(local_7a0);
              auVar236 = ZEXT3264(local_7c0);
              auVar238 = ZEXT3264(local_640);
              auVar244 = ZEXT3264(local_580);
              auVar237 = ZEXT3264(local_7e0);
              auVar239 = ZEXT3264(local_680);
              auVar240 = ZEXT3264(local_6a0);
              auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_,local_490);
              fVar210 = auVar69._0_4_ * 6.0;
              fVar211 = local_880._0_4_ * 6.0;
              auVar174._0_4_ = fVar211 * (float)local_460._0_4_;
              auVar174._4_4_ = fVar211 * (float)local_460._4_4_;
              auVar174._8_4_ = fVar211 * fStack_458;
              auVar174._12_4_ = fVar211 * fStack_454;
              auVar152._4_4_ = fVar210;
              auVar152._0_4_ = fVar210;
              auVar152._8_4_ = fVar210;
              auVar152._12_4_ = fVar210;
              auVar69 = vfmadd132ps_fma(auVar152,auVar174,local_420._0_16_);
              auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_490,local_880._0_16_);
              fVar210 = auVar76._0_4_ * 6.0;
              auVar175._4_4_ = fVar210;
              auVar175._0_4_ = fVar210;
              auVar175._8_4_ = fVar210;
              auVar175._12_4_ = fVar210;
              auVar69 = vfmadd132ps_fma(auVar175,auVar69,local_440._0_16_);
              fVar210 = local_490._0_4_ * 6.0;
              auVar153._4_4_ = fVar210;
              auVar153._0_4_ = fVar210;
              auVar153._8_4_ = fVar210;
              auVar153._12_4_ = fVar210;
              auVar69 = vfmadd132ps_fma(auVar153,auVar69,local_400._0_16_);
              auVar176._0_4_ = auVar69._0_4_ * (float)local_4a0._0_4_;
              auVar176._4_4_ = auVar69._4_4_ * (float)local_4a0._0_4_;
              auVar176._8_4_ = auVar69._8_4_ * (float)local_4a0._0_4_;
              auVar176._12_4_ = auVar69._12_4_ * (float)local_4a0._0_4_;
              auVar69 = vdpps_avx(auVar73,auVar69,0x7f);
              fVar210 = auVar69._0_4_;
              auVar154._0_4_ = auVar73._0_4_ * fVar210;
              auVar154._4_4_ = auVar73._4_4_ * fVar210;
              auVar154._8_4_ = auVar73._8_4_ * fVar210;
              auVar154._12_4_ = auVar73._12_4_ * fVar210;
              auVar76 = vsubps_avx(auVar176,auVar154);
              fVar210 = auVar72._0_4_ * (float)local_4b0._0_4_;
              auVar69 = vmaxss_avx(ZEXT416((uint)fVar186),
                                   ZEXT416((uint)((float)local_8a0._0_4_ * fVar222 * 1.9073486e-06))
                                  );
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(auVar73,auVar23);
              auVar177._0_4_ = fVar202 * auVar76._0_4_ * fVar210;
              auVar177._4_4_ = fVar208 * auVar76._4_4_ * fVar210;
              auVar177._8_4_ = fVar127 * auVar76._8_4_ * fVar210;
              auVar177._12_4_ = fVar209 * auVar76._12_4_ * fVar210;
              auVar72 = vdpps_avx(auVar77,local_830,0x7f);
              auVar76 = vdivss_avx512f(ZEXT416((uint)fVar186),auVar74);
              auVar74 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar186),auVar69);
              auVar71 = vdpps_avx(_local_5a0,auVar177,0x7f);
              vfmadd213ss_avx512f(auVar70,auVar76,auVar74);
              fVar202 = auVar72._0_4_ + auVar71._0_4_;
              auVar71 = vdpps_avx(local_560._0_16_,local_830,0x7f);
              auVar72 = vdpps_avx(_local_5a0,auVar77,0x7f);
              auVar74 = vmulss_avx512f(auVar75,ZEXT416((uint)(fVar162 * -0.5)));
              auVar75 = vmulss_avx512f(auVar75,auVar75);
              fVar162 = auVar74._0_4_ * auVar75._0_4_ + (float)local_820._0_4_;
              auVar74 = vdpps_avx(_local_5a0,local_560._0_16_,0x7f);
              auVar75 = vfnmadd231ss_avx512f(auVar72,local_810,ZEXT416((uint)fVar202));
              auVar70 = vfnmadd231ss_avx512f(auVar74,local_810,auVar71);
              auVar72 = vpermilps_avx(local_740,0xff);
              fVar207 = fVar207 - auVar72._0_4_;
              auVar72 = vshufps_avx(auVar73,auVar73,0xff);
              auVar74 = vfmsub213ss_fma(auVar75,ZEXT416((uint)fVar162),auVar72);
              fVar162 = auVar70._0_4_ * fVar162;
              auVar75 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar74._0_4_)),
                                        ZEXT416((uint)fVar202),ZEXT416((uint)fVar162));
              fVar208 = auVar75._0_4_;
              auVar205._0_4_ = fVar162 / fVar208;
              auVar205._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar189._0_4_ = auVar74._0_4_ / fVar208;
              auVar189._4_12_ = auVar74._4_12_;
              auVar74 = vmulss_avx512f(local_810,auVar205);
              auVar75 = vmulss_avx512f(local_810,auVar189);
              fVar162 = local_880._0_4_ - (auVar74._0_4_ - fVar207 * (auVar71._0_4_ / fVar208));
              auVar217 = ZEXT464((uint)fVar162);
              fVar221 = (float)local_8a0._0_4_ - (fVar207 * (fVar202 / fVar208) - auVar75._0_4_);
              auVar196._8_4_ = 0x7fffffff;
              auVar196._0_8_ = 0x7fffffff7fffffff;
              auVar196._12_4_ = 0x7fffffff;
              auVar71 = vandps_avx512vl(local_810,auVar196);
              auVar71 = vucomiss_avx512f(auVar71);
              bVar64 = true;
              if ((bool)uVar63 || (bool)uVar65) {
LAB_01de168a:
                uVar232 = 0;
                uVar231 = 0;
                uVar201 = 0;
                auVar243 = ZEXT3264(auVar84);
                fVar202 = (float)local_5c0._0_4_;
                fVar162 = (float)local_5c0._4_4_;
                fVar207 = fStack_5b8;
                fVar208 = fStack_5b4;
                fVar127 = fStack_5b0;
                fVar209 = fStack_5ac;
                fVar210 = fStack_5a8;
                fVar211 = fStack_5a4;
              }
              else {
                auVar71 = vaddss_avx512f(auVar69,auVar71);
                auVar74 = vfmadd231ss_fma(auVar71,local_500,ZEXT416(0x36000000));
                auVar71 = vandps_avx(ZEXT416((uint)fVar207),auVar196);
                if (auVar74._0_4_ <= auVar71._0_4_) goto LAB_01de168a;
                fVar221 = fVar221 + (float)local_4f0._0_4_;
                if ((((fVar221 < (ray->org).field_0.m128[3]) ||
                     (fVar223 = ray->tfar, fVar223 < fVar221)) || (fVar162 < 0.0)) ||
                   (1.0 < fVar162)) {
LAB_01de1687:
                  bVar64 = false;
                  unaff_R13 = 0;
                  goto LAB_01de168a;
                }
                auVar50._12_4_ = 0;
                auVar50._0_12_ = ZEXT812(0);
                auVar71 = vrsqrt14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)local_540._0_4_));
                fVar202 = auVar71._0_4_;
                pGVar4 = (context->scene->geometries).items[local_8a8].ptr;
                if ((pGVar4->mask & ray->mask) == 0) goto LAB_01de1687;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  unaff_R13 = 1;
                  bVar64 = false;
                  goto LAB_01de168a;
                }
                fVar202 = fVar202 * 1.5 +
                          (float)local_540._0_4_ * -0.5 * fVar202 * fVar202 * fVar202;
                auVar155._0_4_ = local_5a0._0_4_ * fVar202;
                auVar155._4_4_ = local_5a0._4_4_ * fVar202;
                auVar155._8_4_ = local_5a0._8_4_ * fVar202;
                auVar155._12_4_ = local_5a0._12_4_ * fVar202;
                auVar74 = vfmadd213ps_fma(auVar72,auVar155,auVar73);
                auVar71 = vshufps_avx(auVar155,auVar155,0xc9);
                auVar72 = vshufps_avx(auVar73,auVar73,0xc9);
                auVar156._0_4_ = auVar155._0_4_ * auVar72._0_4_;
                auVar156._4_4_ = auVar155._4_4_ * auVar72._4_4_;
                auVar156._8_4_ = auVar155._8_4_ * auVar72._8_4_;
                auVar156._12_4_ = auVar155._12_4_ * auVar72._12_4_;
                auVar73 = vfmsub231ps_fma(auVar156,auVar73,auVar71);
                auVar71 = vshufps_avx(auVar73,auVar73,0xc9);
                auVar72 = vshufps_avx(auVar74,auVar74,0xc9);
                auVar73 = vshufps_avx(auVar73,auVar73,0xd2);
                auVar133._0_4_ = auVar74._0_4_ * auVar73._0_4_;
                auVar133._4_4_ = auVar74._4_4_ * auVar73._4_4_;
                auVar133._8_4_ = auVar74._8_4_ * auVar73._8_4_;
                auVar133._12_4_ = auVar74._12_4_ * auVar73._12_4_;
                auVar72 = vfmsub231ps_fma(auVar133,auVar71,auVar72);
                auVar71 = vshufps_avx(auVar72,auVar72,0xe9);
                local_610 = vmovlps_avx(auVar71);
                local_608 = auVar72._0_4_;
                local_600 = 0;
                local_5fc = (undefined4)local_8b0;
                local_5f8 = (undefined4)local_8a8;
                local_5f4 = context->user->instID[0];
                local_5f0 = context->user->instPrimID[0];
                ray->tfar = fVar221;
                local_8b4 = -1;
                local_730.valid = &local_8b4;
                local_730.geometryUserPtr = pGVar4->userPtr;
                local_730.context = context->user;
                local_730.hit = (RTCHitN *)&local_610;
                local_730.N = 1;
                auVar243 = ZEXT3264(auVar84);
                local_880._0_16_ = ZEXT416((uint)fVar162);
                local_8a0._0_16_ = ZEXT416((uint)fVar221);
                local_860._0_4_ = fVar223;
                uVar201 = 0;
                uVar231 = 0;
                uVar232 = 0;
                local_730.ray = (RTCRayN *)ray;
                local_604 = fVar162;
                if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01de187e:
                  p_Var5 = context->args->filter;
                  fVar202 = (float)local_5c0._0_4_;
                  fVar162 = (float)local_5c0._4_4_;
                  fVar207 = fStack_5b8;
                  fVar208 = fStack_5b4;
                  fVar127 = fStack_5b0;
                  fVar209 = fStack_5ac;
                  fVar210 = fStack_5a8;
                  fVar211 = fStack_5a4;
                  if (p_Var5 != (RTCFilterFunctionN)0x0) {
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                      (*p_Var5)(&local_730);
                      auVar217 = ZEXT1664(local_880._0_16_);
                      auVar240 = ZEXT3264(local_6a0);
                      auVar239 = ZEXT3264(local_680);
                      auVar237 = ZEXT3264(local_7e0);
                      auVar244 = ZEXT3264(local_580);
                      auVar238 = ZEXT3264(local_640);
                      auVar236 = ZEXT3264(local_7c0);
                      auVar235 = ZEXT3264(local_7a0);
                      auVar242 = ZEXT3264(local_780);
                      auVar241 = ZEXT3264(local_760);
                      auVar229 = ZEXT3264(local_700);
                      auVar227 = ZEXT3264(local_6c0);
                      auVar220 = ZEXT3264(local_6e0);
                      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar243 = ZEXT3264(auVar84);
                      fVar202 = (float)local_5c0._0_4_;
                      fVar162 = (float)local_5c0._4_4_;
                      fVar207 = fStack_5b8;
                      fVar208 = fStack_5b4;
                      fVar127 = fStack_5b0;
                      fVar209 = fStack_5ac;
                      fVar210 = fStack_5a8;
                      fVar211 = fStack_5a4;
                      fVar223 = (float)local_860._0_4_;
                      fVar221 = (float)local_8a0._0_4_;
                      uVar201 = local_8a0._4_4_;
                      uVar231 = local_8a0._8_4_;
                      uVar232 = local_8a0._12_4_;
                    }
                    if (*local_730.valid == 0) goto LAB_01de1956;
                  }
                  unaff_R13 = 1;
                }
                else {
                  (*pGVar4->occlusionFilterN)(&local_730);
                  auVar217 = ZEXT1664(local_880._0_16_);
                  auVar240 = ZEXT3264(local_6a0);
                  auVar239 = ZEXT3264(local_680);
                  auVar237 = ZEXT3264(local_7e0);
                  auVar244 = ZEXT3264(local_580);
                  auVar238 = ZEXT3264(local_640);
                  auVar236 = ZEXT3264(local_7c0);
                  auVar235 = ZEXT3264(local_7a0);
                  auVar242 = ZEXT3264(local_780);
                  auVar241 = ZEXT3264(local_760);
                  auVar229 = ZEXT3264(local_700);
                  auVar227 = ZEXT3264(local_6c0);
                  auVar220 = ZEXT3264(local_6e0);
                  auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar243 = ZEXT3264(auVar84);
                  fVar202 = (float)local_5c0._0_4_;
                  fVar162 = (float)local_5c0._4_4_;
                  fVar207 = fStack_5b8;
                  fVar208 = fStack_5b4;
                  fVar127 = fStack_5b0;
                  fVar209 = fStack_5ac;
                  fVar210 = fStack_5a8;
                  fVar211 = fStack_5a4;
                  fVar223 = (float)local_860._0_4_;
                  fVar221 = (float)local_8a0._0_4_;
                  uVar201 = local_8a0._4_4_;
                  uVar231 = local_8a0._8_4_;
                  uVar232 = local_8a0._12_4_;
                  if (*local_730.valid != 0) goto LAB_01de187e;
LAB_01de1956:
                  unaff_R13 = 0;
                }
                if ((char)unaff_R13 == '\0') {
                  ray->tfar = fVar223;
                }
                bVar64 = false;
              }
              bVar58 = (byte)unaff_R13;
              if (!bVar64) goto LAB_01de196e;
              lVar62 = lVar62 + -1;
            } while (lVar62 != 0);
            bVar58 = 0;
LAB_01de196e:
            unaff_R13 = (ulong)(bVar58 & 1);
            bVar57 = bVar57 | bVar58 & 1;
            auVar52._4_4_ = fStack_35c;
            auVar52._0_4_ = local_360;
            auVar52._8_4_ = fStack_358;
            auVar52._12_4_ = fStack_354;
            auVar52._16_4_ = fStack_350;
            auVar52._20_4_ = fStack_34c;
            auVar52._24_4_ = fStack_348;
            auVar52._28_4_ = fStack_344;
            fVar221 = ray->tfar;
            auVar32._4_4_ = fVar221;
            auVar32._0_4_ = fVar221;
            auVar32._8_4_ = fVar221;
            auVar32._12_4_ = fVar221;
            auVar32._16_4_ = fVar221;
            auVar32._20_4_ = fVar221;
            auVar32._24_4_ = fVar221;
            auVar32._28_4_ = fVar221;
            uVar14 = vcmpps_avx512vl(auVar52,auVar32,2);
            bVar61 = ~('\x01' << ((byte)iVar17 & 0x1f)) & bVar61 & (byte)uVar14;
          } while (bVar61 != 0);
        }
        uVar15 = vpcmpd_avx512vl(local_300,_local_3a0,1);
        uVar16 = vpcmpd_avx512vl(local_300,local_220,1);
        auVar159._0_4_ = fVar202 + (float)local_2a0._0_4_;
        auVar159._4_4_ = fVar162 + (float)local_2a0._4_4_;
        auVar159._8_4_ = fVar207 + fStack_298;
        auVar159._12_4_ = fVar208 + fStack_294;
        auVar159._16_4_ = fVar127 + fStack_290;
        auVar159._20_4_ = fVar209 + fStack_28c;
        auVar159._24_4_ = fVar210 + fStack_288;
        auVar159._28_4_ = fVar211 + fStack_284;
        fVar186 = ray->tfar;
        auVar182._4_4_ = fVar186;
        auVar182._0_4_ = fVar186;
        auVar182._8_4_ = fVar186;
        auVar182._12_4_ = fVar186;
        auVar182._16_4_ = fVar186;
        auVar182._20_4_ = fVar186;
        auVar182._24_4_ = fVar186;
        auVar182._28_4_ = fVar186;
        uVar14 = vcmpps_avx512vl(auVar159,auVar182,2);
        bVar61 = (byte)local_7e8 & (byte)uVar16 & (byte)uVar14;
        auVar190._0_4_ = fVar202 + (float)local_260._0_4_;
        auVar190._4_4_ = fVar162 + (float)local_260._4_4_;
        auVar190._8_4_ = fVar207 + fStack_258;
        auVar190._12_4_ = fVar208 + fStack_254;
        auVar190._16_4_ = fVar127 + fStack_250;
        auVar190._20_4_ = fVar209 + fStack_24c;
        auVar190._24_4_ = fVar210 + fStack_248;
        auVar190._28_4_ = fVar211 + fStack_244;
        uVar14 = vcmpps_avx512vl(auVar190,auVar182,2);
        bVar59 = bVar59 & (byte)uVar15 & (byte)uVar14 | bVar61;
        prim = local_5d8;
        if (bVar59 != 0) {
          uVar67 = local_5c8 & 0xffffffff;
          abStack_180[uVar67 * 0x60] = bVar59;
          auVar118._0_4_ =
               (uint)(bVar61 & 1) * local_2a0._0_4_ | (uint)!(bool)(bVar61 & 1) * local_260._0_4_;
          bVar64 = (bool)(bVar61 >> 1 & 1);
          auVar118._4_4_ = (uint)bVar64 * local_2a0._4_4_ | (uint)!bVar64 * local_260._4_4_;
          bVar64 = (bool)(bVar61 >> 2 & 1);
          auVar118._8_4_ = (uint)bVar64 * (int)fStack_298 | (uint)!bVar64 * (int)fStack_258;
          bVar64 = (bool)(bVar61 >> 3 & 1);
          auVar118._12_4_ = (uint)bVar64 * (int)fStack_294 | (uint)!bVar64 * (int)fStack_254;
          bVar64 = (bool)(bVar61 >> 4 & 1);
          auVar118._16_4_ = (uint)bVar64 * (int)fStack_290 | (uint)!bVar64 * (int)fStack_250;
          bVar64 = (bool)(bVar61 >> 5 & 1);
          auVar118._20_4_ = (uint)bVar64 * (int)fStack_28c | (uint)!bVar64 * (int)fStack_24c;
          bVar64 = (bool)(bVar61 >> 6 & 1);
          auVar118._24_4_ = (uint)bVar64 * (int)fStack_288 | (uint)!bVar64 * (int)fStack_248;
          auVar118._28_4_ =
               (uint)(bVar61 >> 7) * (int)fStack_284 | (uint)!(bool)(bVar61 >> 7) * (int)fStack_244;
          *(undefined1 (*) [32])(auStack_160 + uVar67 * 0x60) = auVar118;
          uVar14 = vmovlps_avx(local_510);
          *(undefined8 *)(afStack_140 + uVar67 * 0x18) = uVar14;
          auStack_138[uVar67 * 0x18] = (int)local_7f8 + 1;
          local_5c8 = (ulong)((int)local_5c8 + 1);
        }
      }
    }
    fVar186 = ray->tfar;
    auVar144._4_4_ = fVar186;
    auVar144._0_4_ = fVar186;
    auVar144._8_4_ = fVar186;
    auVar144._12_4_ = fVar186;
    auVar144._16_4_ = fVar186;
    auVar144._20_4_ = fVar186;
    auVar144._24_4_ = fVar186;
    auVar144._28_4_ = fVar186;
    uVar67 = local_5c8;
    do {
      if ((int)uVar67 == 0) {
        if (bVar57 != 0) {
          return bVar66;
        }
        fVar202 = ray->tfar;
        auVar33._4_4_ = fVar202;
        auVar33._0_4_ = fVar202;
        auVar33._8_4_ = fVar202;
        auVar33._12_4_ = fVar202;
        auVar33._16_4_ = fVar202;
        auVar33._20_4_ = fVar202;
        auVar33._24_4_ = fVar202;
        auVar33._28_4_ = fVar202;
        uVar14 = vcmpps_avx512vl(local_200,auVar33,2);
        uVar68 = (uint)local_5d0 & (uint)uVar14;
        local_5d0 = (ulong)uVar68;
        bVar66 = uVar68 != 0;
        if (!bVar66) {
          return bVar66;
        }
        goto LAB_01ddf5b0;
      }
      uVar60 = (ulong)((int)uVar67 - 1);
      lVar62 = uVar60 * 0x60;
      auVar84 = *(undefined1 (*) [32])(auStack_160 + lVar62);
      auVar183._0_4_ = fVar202 + auVar84._0_4_;
      auVar183._4_4_ = fVar162 + auVar84._4_4_;
      auVar183._8_4_ = fVar207 + auVar84._8_4_;
      auVar183._12_4_ = fVar208 + auVar84._12_4_;
      auVar183._16_4_ = fVar127 + auVar84._16_4_;
      auVar183._20_4_ = fVar209 + auVar84._20_4_;
      auVar183._24_4_ = fVar210 + auVar84._24_4_;
      auVar183._28_4_ = fVar211 + auVar84._28_4_;
      uVar14 = vcmpps_avx512vl(auVar183,auVar144,2);
      uVar68 = (uint)uVar14 & (uint)abStack_180[lVar62];
      bVar59 = (byte)uVar68;
      local_5c8 = uVar60;
      if (uVar68 != 0) {
        auVar184._8_4_ = 0x7f800000;
        auVar184._0_8_ = 0x7f8000007f800000;
        auVar184._12_4_ = 0x7f800000;
        auVar184._16_4_ = 0x7f800000;
        auVar184._20_4_ = 0x7f800000;
        auVar184._24_4_ = 0x7f800000;
        auVar184._28_4_ = 0x7f800000;
        auVar85 = vblendmps_avx512vl(auVar184,auVar84);
        auVar119._0_4_ =
             (uint)(bVar59 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar59 & 1) * (int)auVar84._0_4_;
        bVar64 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar119._4_4_ = (uint)bVar64 * auVar85._4_4_ | (uint)!bVar64 * (int)auVar84._4_4_;
        bVar64 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar119._8_4_ = (uint)bVar64 * auVar85._8_4_ | (uint)!bVar64 * (int)auVar84._8_4_;
        bVar64 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar119._12_4_ = (uint)bVar64 * auVar85._12_4_ | (uint)!bVar64 * (int)auVar84._12_4_;
        bVar64 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar119._16_4_ = (uint)bVar64 * auVar85._16_4_ | (uint)!bVar64 * (int)auVar84._16_4_;
        bVar64 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar119._20_4_ = (uint)bVar64 * auVar85._20_4_ | (uint)!bVar64 * (int)auVar84._20_4_;
        bVar64 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar119._24_4_ = (uint)bVar64 * auVar85._24_4_ | (uint)!bVar64 * (int)auVar84._24_4_;
        auVar119._28_4_ =
             (uVar68 >> 7) * auVar85._28_4_ | (uint)!SUB41(uVar68 >> 7,0) * (int)auVar84._28_4_;
        auVar84 = vshufps_avx(auVar119,auVar119,0xb1);
        auVar84 = vminps_avx(auVar119,auVar84);
        auVar85 = vshufpd_avx(auVar84,auVar84,5);
        auVar84 = vminps_avx(auVar84,auVar85);
        auVar85 = vpermpd_avx2(auVar84,0x4e);
        auVar84 = vminps_avx(auVar84,auVar85);
        uVar14 = vcmpps_avx512vl(auVar119,auVar84,0);
        bVar61 = (byte)uVar14 & bVar59;
        if (bVar61 != 0) {
          uVar68 = (uint)bVar61;
        }
        fVar186 = afStack_140[uVar60 * 0x18 + 1];
        uVar120 = 0;
        for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
          uVar120 = uVar120 + 1;
        }
        unaff_R13 = (ulong)auStack_138[uVar60 * 0x18];
        bVar61 = ~('\x01' << ((byte)uVar120 & 0x1f)) & bVar59;
        abStack_180[lVar62] = bVar61;
        if (bVar61 != 0) {
          local_5c8 = uVar67 & 0xffffffff;
        }
        fVar221 = afStack_140[uVar60 * 0x18];
        auVar185._4_4_ = fVar221;
        auVar185._0_4_ = fVar221;
        auVar185._8_4_ = fVar221;
        auVar185._12_4_ = fVar221;
        auVar185._16_4_ = fVar221;
        auVar185._20_4_ = fVar221;
        auVar185._24_4_ = fVar221;
        auVar185._28_4_ = fVar221;
        fVar186 = fVar186 - fVar221;
        auVar160._4_4_ = fVar186;
        auVar160._0_4_ = fVar186;
        auVar160._8_4_ = fVar186;
        auVar160._12_4_ = fVar186;
        auVar160._16_4_ = fVar186;
        auVar160._20_4_ = fVar186;
        auVar160._24_4_ = fVar186;
        auVar160._28_4_ = fVar186;
        auVar71 = vfmadd132ps_fma(auVar160,auVar185,_DAT_02020f20);
        _local_2a0 = ZEXT1632(auVar71);
        local_510._8_8_ = 0;
        local_510._0_8_ = *(ulong *)(local_2a0 + (ulong)uVar120 * 4);
        local_7f8 = unaff_R13;
      }
      uVar67 = local_5c8;
    } while (bVar59 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }